

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_tan>(Mat *a,Option *opt)

{
  bool bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [48];
  undefined1 auVar61 [24];
  undefined1 auVar62 [24];
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  long *in_RDI;
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  float fVar107;
  undefined1 auVar108 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tan op;
  Mat *m;
  __m512 ytan;
  __mmask16 mask;
  __m512 eps;
  __m512 ycos;
  __m512 ysin;
  __m512 ysin1;
  __m512 ysin2;
  __m512 y2;
  __m512 z;
  __m512 sign_bit_cos;
  __m512 poly_mask;
  __m512 swap_sign_bit_sin;
  __m512i imm4;
  __m512i imm2;
  __m512i imm0;
  __m512 y;
  __m512 sign_bit_sin;
  __m512 xmm3;
  __m512 xmm2;
  __m512 xmm1;
  __m256 ytan_1;
  __m256 _tmp;
  __m256 mask_1;
  __m256 eps_1;
  __m256 ycos_1;
  __m256 ysin_1;
  __m256 ysin1_1;
  __m256 ysin2_1;
  __m256 y2_1;
  __m256 z_1;
  __m256 sign_bit_cos_1;
  __m256 poly_mask_1;
  __m256 swap_sign_bit_sin_1;
  __m256i imm4_1;
  __m256i imm2_1;
  __m256i imm0_1;
  __m256 y_1;
  __m256 sign_bit_sin_1;
  __m256 xmm3_1;
  __m256 xmm2_1;
  __m256 xmm1_1;
  __m128 ytan_2;
  __m128 _tmp_1;
  __m128 mask_2;
  __m128 eps_2;
  __m128 ycos_2;
  __m128 ysin_2;
  v4sf ysin1_2;
  v4sf ysin2_2;
  v4sf y2_2;
  v4sf z_2;
  v4sf sign_bit_cos_2;
  v4sf poly_mask_2;
  v4sf swap_sign_bit_sin_2;
  v4si emm4;
  v4si emm2;
  v4si emm0;
  v4sf y_2;
  v4sf sign_bit_sin_2;
  v4sf xmm3_2;
  v4sf xmm2_2;
  v4sf xmm1_2;
  undefined8 local_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  int local_3a3c;
  undefined8 local_3a38;
  undefined8 local_3a30;
  undefined8 local_3a28;
  undefined4 local_3a20;
  long local_3a18;
  undefined4 local_3a10;
  undefined4 local_3a0c;
  undefined4 local_3a08;
  undefined4 local_3a04;
  undefined4 local_3a00;
  undefined8 local_39f8;
  undefined1 (*local_39f0) [64];
  int local_39e8;
  int local_39e4;
  int local_39e0;
  int local_39dc;
  int local_39d8;
  int local_39d4;
  int local_39d0;
  undefined1 local_39c9 [9];
  long *local_39c0;
  undefined1 local_39b5;
  int local_39b4;
  undefined8 *local_39a8;
  undefined8 *local_39a0;
  undefined8 *local_3990;
  undefined1 (*local_3988) [64];
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined1 (*local_3910) [64];
  undefined1 (*local_3908) [64];
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined1 (*local_38e0) [64];
  undefined1 (*local_38d8) [64];
  undefined8 local_38d0;
  undefined8 uStack_38c8;
  undefined1 (*local_38c0) [64];
  long local_38b8;
  undefined4 local_38ac;
  long local_38a8;
  undefined1 (*local_38a0) [64];
  undefined4 local_3894;
  int local_3890;
  int local_388c;
  undefined8 *local_3888;
  undefined4 local_387c;
  long local_3878;
  undefined8 *local_3868;
  undefined8 *local_3840;
  undefined1 *local_3838;
  undefined8 *local_3830;
  undefined1 *local_3828;
  undefined8 *local_3820;
  undefined1 *local_3818;
  undefined1 (*local_3810) [64];
  undefined1 *local_3808;
  undefined1 local_3800 [64];
  ushort local_3782;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 uStack_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  uint local_3740;
  uint uStack_373c;
  uint uStack_3738;
  uint uStack_3734;
  uint uStack_3730;
  uint uStack_372c;
  uint uStack_3728;
  uint uStack_3724;
  uint uStack_3720;
  uint uStack_371c;
  uint uStack_3718;
  uint uStack_3714;
  uint uStack_3710;
  uint uStack_370c;
  uint uStack_3708;
  uint uStack_3704;
  undefined1 local_3700 [64];
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 uStack_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  ushort local_3582;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 uStack_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined1 local_34c0 [64];
  undefined4 local_3444;
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [8];
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 uStack_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [8];
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined1 local_3180 [64];
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 uStack_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined1 local_3100 [8];
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined1 local_30c0 [8];
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  uint *local_3050;
  undefined1 *local_3048;
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  undefined1 local_2f40 [64];
  undefined1 local_2f00 [64];
  undefined4 local_2e84;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  int local_2e00 [16];
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  float local_2a80 [16];
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  float local_2940 [16];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  float local_2880 [16];
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  float local_2800 [32];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  float local_2700 [16];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  float local_2680 [16];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  float local_2600 [16];
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  float local_2540 [16];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  float local_2480 [16];
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  float local_23c0 [16];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  float local_2240 [16];
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined4 local_20c4;
  undefined1 local_20c0 [64];
  undefined4 local_2044;
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined2 local_1e82;
  undefined1 local_1e80 [64];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  undefined1 local_18e0 [32];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined4 local_17e4;
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [8];
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  undefined4 uStack_1770;
  undefined4 uStack_176c;
  undefined4 uStack_1768;
  undefined4 uStack_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  ulong local_1720;
  ulong uStack_1718;
  ulong uStack_1710;
  ulong uStack_1708;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [8];
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  ulong local_1680;
  ulong uStack_1678;
  ulong uStack_1670;
  ulong uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  float *local_15f0;
  undefined1 *local_15e8;
  undefined1 local_15e0 [32];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  ulong local_1580;
  ulong uStack_1578;
  ulong uStack_1570;
  ulong uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined4 local_1520;
  undefined4 uStack_151c;
  undefined4 uStack_1518;
  undefined4 uStack_1514;
  undefined4 uStack_1510;
  undefined4 uStack_150c;
  undefined4 uStack_1508;
  undefined4 uStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined4 local_14e0;
  undefined4 uStack_14dc;
  undefined4 uStack_14d8;
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  undefined4 uStack_14c8;
  undefined4 uStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 *local_12b8;
  undefined1 *local_12b0;
  undefined1 *local_12a8;
  float *local_12a0;
  float *local_1298;
  undefined1 *local_1290;
  float *local_1288;
  float *local_1280;
  undefined1 *local_1278;
  float *local_1270;
  float *local_1268;
  undefined1 *local_1260;
  float *local_1258;
  float *local_1250;
  undefined1 *local_1248;
  undefined1 *local_1240;
  undefined8 *local_1238;
  undefined1 *local_1230;
  undefined1 *local_1228;
  float *local_1220;
  undefined1 *local_1218;
  undefined1 *local_1210;
  float *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  float *local_11f0;
  float *local_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined4 local_1160;
  undefined4 uStack_115c;
  undefined4 uStack_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1148;
  undefined4 uStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined4 local_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined4 local_1064;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0 [2];
  float afStack_eb8 [2];
  float afStack_eb0 [2];
  float afStack_ea8 [2];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00 [2];
  float afStack_df8 [2];
  float afStack_df0 [2];
  float afStack_de8 [2];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined4 local_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  ulong local_a40;
  ulong uStack_a38;
  ulong uStack_a30;
  ulong uStack_a28;
  ulong local_a20;
  ulong uStack_a18;
  ulong uStack_a10;
  ulong uStack_a08;
  ulong local_a00;
  ulong uStack_9f8;
  ulong uStack_9f0;
  ulong uStack_9e8;
  ulong local_9e0;
  ulong uStack_9d8;
  ulong uStack_9d0;
  ulong uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined8 local_890;
  undefined8 uStack_888;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  undefined1 local_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 local_7e4;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  ulong local_780;
  ulong uStack_778;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  ulong local_730;
  ulong uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float *local_6f0;
  undefined1 *local_6e8;
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  ulong local_6b0;
  ulong uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined4 local_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined4 local_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 *local_4c8;
  float *local_4c0;
  float *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  float *local_498;
  float *local_490;
  undefined1 *local_488;
  float *local_480;
  float *local_478;
  undefined1 *local_470;
  float *local_468;
  float *local_460;
  undefined1 *local_458;
  float *local_450;
  float *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined8 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  float *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  float *local_400;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  ulong local_110;
  ulong uStack_108;
  ulong local_100;
  ulong uStack_f8;
  ulong local_f0;
  ulong uStack_e8;
  ulong local_e0;
  ulong uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  
  local_39d0 = *(int *)((long)in_RDI + 0x2c);
  local_39d4 = (int)in_RDI[6];
  local_39d8 = *(int *)((long)in_RDI + 0x34);
  local_39dc = (int)in_RDI[7];
  local_39e0 = (int)in_RDI[3];
  local_39e4 = local_39d0 * local_39d4 * local_39d8 * local_39e0;
  local_39c0 = in_RDI;
  for (local_39e8 = 0; local_39e8 < local_39dc; local_39e8 = local_39e8 + 1) {
    local_39a8 = &local_3a38;
    local_388c = *(int *)((long)local_39c0 + 0x2c);
    local_3890 = (int)local_39c0[6];
    local_3894 = *(undefined4 *)((long)local_39c0 + 0x34);
    local_38a0 = (undefined1 (*) [64])
                 (*local_39c0 + local_39c0[8] * (long)local_39e8 * local_39c0[2]);
    local_38a8 = local_39c0[2];
    local_38ac = (undefined4)local_39c0[3];
    local_38b8 = local_39c0[4];
    local_3888 = &local_3a38;
    local_3878 = (long)local_388c * (long)local_3890 * local_38a8;
    local_39a0 = &local_3a38;
    local_3990 = &local_3a38;
    local_387c = 0x10;
    local_39b4 = local_39e8;
    local_39b5 = 1;
    local_3a38 = 0;
    local_3a28 = 0;
    local_3a20 = 0;
    local_3a10 = 0;
    local_3a0c = 0;
    local_3a08 = 0;
    local_3a04 = 0;
    local_3a00 = 0;
    local_39f8 = 0;
    local_3a30 = 0;
    local_39f0 = local_38a0;
    for (local_3a3c = 0; uVar13 = local_1660, uVar91 = uStack_1658, uVar92 = uStack_1650,
        uVar93 = uStack_1648, local_3a3c + 0xf < local_39e4; local_3a3c = local_3a3c + 0x10) {
      local_3988 = local_39f0;
      local_36c0 = *(undefined8 *)*local_39f0;
      uStack_36b8 = *(undefined8 *)(*local_39f0 + 8);
      uStack_36b0 = *(undefined8 *)(*local_39f0 + 0x10);
      uStack_36a8 = *(undefined8 *)(*local_39f0 + 0x18);
      uStack_36a0 = *(undefined8 *)(*local_39f0 + 0x20);
      uStack_3698 = *(undefined8 *)(*local_39f0 + 0x28);
      auVar60 = *(undefined1 (*) [48])*local_39f0;
      uStack_3690 = *(undefined8 *)(*local_39f0 + 0x30);
      uStack_3688 = *(undefined8 *)(*local_39f0 + 0x38);
      local_3838 = local_39c9;
      local_3840 = &local_3a80;
      local_3444 = 0x322bcc77;
      local_34c0 = vbroadcastss_avx512f(ZEXT416(0x322bcc77));
      local_3780 = local_34c0._0_8_;
      uStack_3778 = local_34c0._8_8_;
      uStack_3770 = local_34c0._16_8_;
      uStack_3768 = local_34c0._24_8_;
      uStack_3760 = local_34c0._32_8_;
      uStack_3758 = local_34c0._40_8_;
      uStack_3750 = local_34c0._48_8_;
      uStack_3748 = local_34c0._56_8_;
      local_3048 = local_3700;
      local_3050 = &local_3740;
      local_3040._0_8_ = auVar60._0_8_;
      local_3040._8_8_ = auVar60._8_8_;
      local_3040._16_8_ = auVar60._16_8_;
      local_3040._24_8_ = auVar60._24_8_;
      local_3040._32_8_ = auVar60._32_8_;
      local_3040._40_8_ = auVar60._40_8_;
      local_1fc0 = local_3040._0_8_;
      uStack_1fb8 = local_3040._8_8_;
      uStack_1fb0 = local_3040._16_8_;
      uStack_1fa8 = local_3040._24_8_;
      uStack_1fa0 = local_3040._32_8_;
      uStack_1f98 = local_3040._40_8_;
      local_2e84 = 0x7fffffff;
      auVar100 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_2f00 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(local_2f00);
      local_1e40 = local_3040._0_8_;
      uStack_1e38 = local_3040._8_8_;
      uStack_1e30 = local_3040._16_8_;
      uStack_1e28 = local_3040._24_8_;
      uStack_1e20 = local_3040._32_8_;
      uStack_1e18 = local_3040._40_8_;
      local_1e80 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(*local_39f0);
      auVar101 = vmovdqa64_avx512f(local_1e80);
      auVar100 = vpandq_avx512f(auVar100,auVar101);
      local_2f40 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(local_2f40);
      auVar100 = vmovdqa64_avx512f(auVar100);
      local_2dc0 = local_3040._0_8_;
      uStack_2db8 = local_3040._8_8_;
      uStack_2db0 = local_3040._16_8_;
      uStack_2da8 = local_3040._24_8_;
      uStack_2da0 = local_3040._32_8_;
      uStack_2d98 = local_3040._40_8_;
      local_2e00[0] = -0x80000000;
      local_2e00[1] = -0x80000000;
      local_2e00[2] = -0x80000000;
      local_2e00[3] = -0x80000000;
      local_2e00[4] = -0x80000000;
      local_2e00[5] = -0x80000000;
      local_2e00[6] = -0x80000000;
      local_2e00[7] = -0x80000000;
      local_2e00[8] = -0x80000000;
      local_2e00[9] = -0x80000000;
      local_2e00[10] = -0x80000000;
      local_2e00[0xb] = -0x80000000;
      local_2e00[0xc] = -0x80000000;
      local_2e00[0xd] = -0x80000000;
      local_2e00[0xe] = -0x80000000;
      local_2e00[0xf] = -0x80000000;
      auVar102 = vmovdqa64_avx512f(*local_39f0);
      auVar101._8_4_ = -0x80000000;
      auVar101._12_4_ = -0x80000000;
      auVar101._0_4_ = -0x80000000;
      auVar101._4_4_ = -0x80000000;
      auVar101._16_4_ = -0x80000000;
      auVar101._20_4_ = -0x80000000;
      auVar101._24_4_ = -0x80000000;
      auVar101._28_4_ = -0x80000000;
      auVar101._32_4_ = -0x80000000;
      auVar101._36_4_ = -0x80000000;
      auVar101._40_4_ = -0x80000000;
      auVar101._44_4_ = -0x80000000;
      auVar101._48_4_ = -0x80000000;
      auVar101._52_4_ = -0x80000000;
      auVar101._56_4_ = -0x80000000;
      auVar101._60_4_ = -0x80000000;
      auVar101 = vmovdqa64_avx512f(auVar101);
      auVar101 = vpandd_avx512f(auVar102,auVar101);
      auVar101 = vmovdqa64_avx512f(auVar101);
      local_3040._0_8_ = auVar100._0_8_;
      local_3040._8_8_ = auVar100._8_8_;
      local_3040._16_8_ = auVar100._16_8_;
      local_3040._24_8_ = auVar100._24_8_;
      local_3040._32_8_ = auVar100._32_8_;
      local_3040._40_8_ = auVar100._40_8_;
      local_3040._48_8_ = auVar100._48_8_;
      local_3040._56_8_ = auVar100._56_8_;
      local_2a40 = local_3040._0_8_;
      uStack_2a38 = local_3040._8_8_;
      uStack_2a30 = local_3040._16_8_;
      uStack_2a28 = local_3040._24_8_;
      uStack_2a20 = local_3040._32_8_;
      uStack_2a18 = local_3040._40_8_;
      uStack_2a10 = local_3040._48_8_;
      uStack_2a08 = local_3040._56_8_;
      local_2a80[0] = 1.2732395;
      local_2a80[1] = 1.2732395;
      local_2a80[2] = 1.2732395;
      local_2a80[3] = 1.2732395;
      local_2a80[4] = 1.2732395;
      local_2a80[5] = 1.2732395;
      local_2a80[6] = 1.2732395;
      local_2a80[7] = 1.2732395;
      local_2a80[8] = 1.2732395;
      local_2a80[9] = 1.2732395;
      local_2a80[10] = 1.2732395;
      local_2a80[0xb] = 1.2732395;
      local_2a80[0xc] = 1.2732395;
      local_2a80[0xd] = 1.2732395;
      local_2a80[0xe] = 1.2732395;
      local_2a80[0xf] = 1.2732395;
      auVar102._8_4_ = 1.2732395;
      auVar102._12_4_ = 1.2732395;
      auVar102._0_4_ = 1.2732395;
      auVar102._4_4_ = 1.2732395;
      auVar102._16_4_ = 1.2732395;
      auVar102._20_4_ = 1.2732395;
      auVar102._24_4_ = 1.2732395;
      auVar102._28_4_ = 1.2732395;
      auVar102._32_4_ = 1.2732395;
      auVar102._36_4_ = 1.2732395;
      auVar102._40_4_ = 1.2732395;
      auVar102._44_4_ = 1.2732395;
      auVar102._48_4_ = 1.2732395;
      auVar102._52_4_ = 1.2732395;
      auVar102._56_4_ = 1.2732395;
      auVar102._60_4_ = 1.2732395;
      auVar102 = vmulps_avx512f(auVar100,auVar102);
      local_31c0 = auVar102._0_8_;
      uStack_31b8 = auVar102._8_8_;
      uStack_31b0 = auVar102._16_8_;
      uStack_31a8 = auVar102._24_8_;
      uStack_31a0 = auVar102._32_8_;
      uStack_3198 = auVar102._40_8_;
      uStack_3190 = auVar102._48_8_;
      uStack_3188 = auVar102._56_8_;
      local_21c0 = local_31c0;
      uStack_21b8 = uStack_31b8;
      uStack_21b0 = uStack_31b0;
      uStack_21a8 = uStack_31a8;
      uStack_21a0 = uStack_31a0;
      uStack_2198 = uStack_3198;
      uStack_2190 = uStack_3190;
      uStack_2188 = uStack_3188;
      auVar102 = vcvttps2dq_avx512f(auVar102);
      local_2000 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar103 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_1);
      local_2140 = vmovdqa64_avx512f(auVar102);
      local_2180 = vmovdqa64_avx512f(auVar103);
      auVar102 = vmovdqa64_avx512f(local_2140);
      auVar103 = vmovdqa64_avx512f(local_2180);
      auVar102 = vpaddd_avx512f(auVar102,auVar103);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar103 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_inv1);
      local_1cc0 = vmovdqa64_avx512f(auVar102);
      local_1d00 = vmovdqa64_avx512f(auVar103);
      auVar102 = vmovdqa64_avx512f(local_1cc0);
      auVar103 = vmovdqa64_avx512f(local_1d00);
      auVar102 = vpandq_avx512f(auVar102,auVar103);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar103 = vmovdqa64_avx512f(auVar102);
      local_1f00 = vmovdqa64_avx512f(auVar103);
      auVar104 = vcvtdq2ps_avx512f(local_1f00);
      auVar103 = vmovdqa64_avx512f(auVar102);
      auVar103 = vmovdqa64_avx512f(auVar103);
      auVar105 = vmovdqa64_avx512f(auVar102);
      auVar106 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_4);
      local_1d40 = vmovdqa64_avx512f(auVar105);
      local_1d80 = vmovdqa64_avx512f(auVar106);
      auVar105 = vmovdqa64_avx512f(local_1d40);
      auVar106 = vmovdqa64_avx512f(local_1d80);
      auVar105 = vpandq_avx512f(auVar105,auVar106);
      auVar105 = vmovdqa64_avx512f(auVar105);
      auVar105 = vmovdqa64_avx512f(auVar105);
      local_2040 = vmovdqa64_avx512f(auVar105);
      local_2044 = 0x1d;
      auVar105 = vmovdqa64_avx512f(local_2040);
      auVar105 = vpslld_avx512f(auVar105,ZEXT416(0x1d));
      local_3200 = vmovdqa64_avx512f(auVar105);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar105 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
      local_1dc0 = vmovdqa64_avx512f(auVar102);
      local_1e00 = vmovdqa64_avx512f(auVar105);
      auVar102 = vmovdqa64_avx512f(local_1dc0);
      auVar105 = vmovdqa64_avx512f(local_1e00);
      auVar102 = vpandq_avx512f(auVar102,auVar105);
      auVar102 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(auVar102);
      uVar14 = vptestnmd_avx512f(auVar102,auVar102);
      local_1e82 = (undefined2)uVar14;
      auVar102 = vpmovm2d_avx512dq(uVar14 & 0xffff);
      local_3240 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(local_3200);
      local_2f80 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(local_2f80);
      local_32c0 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(local_3240);
      local_2fc0 = vmovdqa64_avx512f(auVar102);
      auVar102 = vmovdqa64_avx512f(local_2fc0);
      local_3300 = vmovdqa64_avx512f(auVar102);
      uStack_30b8._0_4_ = -0.78515625;
      uStack_30b8._4_4_ = -0.78515625;
      local_30c0._0_4_ = -0.78515625;
      local_30c0._4_4_ = -0.78515625;
      uStack_30f8._0_4_ = -0.00024187565;
      uStack_30f8._4_4_ = -0.00024187565;
      local_3100._0_4_ = -0.00024187565;
      local_3100._4_4_ = -0.00024187565;
      local_31c0 = auVar104._0_8_;
      uStack_31b8 = auVar104._8_8_;
      uStack_31b0 = auVar104._16_8_;
      uStack_31a8 = auVar104._24_8_;
      uStack_31a0 = auVar104._32_8_;
      uStack_3198 = auVar104._40_8_;
      uStack_3190 = auVar104._48_8_;
      uStack_3188 = auVar104._56_8_;
      local_2440 = local_31c0;
      uStack_2438 = uStack_31b8;
      uStack_2430 = uStack_31b0;
      uStack_2428 = uStack_31a8;
      uStack_2420 = uStack_31a0;
      uStack_2418 = uStack_3198;
      uStack_2410 = uStack_3190;
      uStack_2408 = uStack_3188;
      local_2480[0] = -0.78515625;
      local_2480[1] = -0.78515625;
      local_2480[2] = -0.78515625;
      local_2480[3] = -0.78515625;
      local_2480[4] = -0.78515625;
      local_2480[5] = -0.78515625;
      local_2480[6] = -0.78515625;
      local_2480[7] = -0.78515625;
      local_2480[8] = -0.78515625;
      local_2480[9] = -0.78515625;
      local_2480[10] = -0.78515625;
      local_2480[0xb] = -0.78515625;
      local_2480[0xc] = -0.78515625;
      local_2480[0xd] = -0.78515625;
      local_2480[0xe] = -0.78515625;
      local_2480[0xf] = -0.78515625;
      local_24c0 = local_3040._0_8_;
      uStack_24b8 = local_3040._8_8_;
      uStack_24b0 = local_3040._16_8_;
      uStack_24a8 = local_3040._24_8_;
      uStack_24a0 = local_3040._32_8_;
      uStack_2498 = local_3040._40_8_;
      uStack_2490 = local_3040._48_8_;
      uStack_2488 = local_3040._56_8_;
      auVar18._16_4_ = -0.78515625;
      auVar18._20_4_ = -0.78515625;
      auVar18._0_16_ = _local_30c0;
      auVar18._24_4_ = -0.78515625;
      auVar18._28_4_ = -0.78515625;
      auVar18._32_4_ = -0.78515625;
      auVar18._36_4_ = -0.78515625;
      auVar18._40_4_ = -0.78515625;
      auVar18._44_4_ = -0.78515625;
      auVar18._48_4_ = -0.78515625;
      auVar18._52_4_ = -0.78515625;
      auVar18._56_4_ = -0.78515625;
      auVar18._60_4_ = -0.78515625;
      auVar100 = vfmadd213ps_avx512f(auVar18,auVar104,auVar100);
      local_3040._0_8_ = auVar100._0_8_;
      local_3040._8_8_ = auVar100._8_8_;
      local_3040._16_8_ = auVar100._16_8_;
      local_3040._24_8_ = auVar100._24_8_;
      local_3040._32_8_ = auVar100._32_8_;
      local_3040._40_8_ = auVar100._40_8_;
      local_3040._48_8_ = auVar100._48_8_;
      local_3040._56_8_ = auVar100._56_8_;
      local_2500 = local_31c0;
      uStack_24f8 = uStack_31b8;
      uStack_24f0 = uStack_31b0;
      uStack_24e8 = uStack_31a8;
      uStack_24e0 = uStack_31a0;
      uStack_24d8 = uStack_3198;
      uStack_24d0 = uStack_3190;
      uStack_24c8 = uStack_3188;
      local_2540[0] = -0.00024187565;
      local_2540[1] = -0.00024187565;
      local_2540[2] = -0.00024187565;
      local_2540[3] = -0.00024187565;
      local_2540[4] = -0.00024187565;
      local_2540[5] = -0.00024187565;
      local_2540[6] = -0.00024187565;
      local_2540[7] = -0.00024187565;
      local_2540[8] = -0.00024187565;
      local_2540[9] = -0.00024187565;
      local_2540[10] = -0.00024187565;
      local_2540[0xb] = -0.00024187565;
      local_2540[0xc] = -0.00024187565;
      local_2540[0xd] = -0.00024187565;
      local_2540[0xe] = -0.00024187565;
      local_2540[0xf] = -0.00024187565;
      local_2580 = local_3040._0_8_;
      uStack_2578 = local_3040._8_8_;
      uStack_2570 = local_3040._16_8_;
      uStack_2568 = local_3040._24_8_;
      uStack_2560 = local_3040._32_8_;
      uStack_2558 = local_3040._40_8_;
      uStack_2550 = local_3040._48_8_;
      uStack_2548 = local_3040._56_8_;
      auVar17._16_4_ = -0.00024187565;
      auVar17._20_4_ = -0.00024187565;
      auVar17._0_16_ = _local_3100;
      auVar17._24_4_ = -0.00024187565;
      auVar17._28_4_ = -0.00024187565;
      auVar17._32_4_ = -0.00024187565;
      auVar17._36_4_ = -0.00024187565;
      auVar17._40_4_ = -0.00024187565;
      auVar17._44_4_ = -0.00024187565;
      auVar17._48_4_ = -0.00024187565;
      auVar17._52_4_ = -0.00024187565;
      auVar17._56_4_ = -0.00024187565;
      auVar17._60_4_ = -0.00024187565;
      auVar100 = vfmadd213ps_avx512f(auVar17,auVar104,auVar100);
      local_3040._0_8_ = auVar100._0_8_;
      local_3040._8_8_ = auVar100._8_8_;
      local_3040._16_8_ = auVar100._16_8_;
      local_3040._24_8_ = auVar100._24_8_;
      local_3040._32_8_ = auVar100._32_8_;
      local_3040._40_8_ = auVar100._40_8_;
      local_3040._48_8_ = auVar100._48_8_;
      local_3040._56_8_ = auVar100._56_8_;
      local_25c0 = local_31c0;
      uStack_25b8 = uStack_31b8;
      uStack_25b0 = uStack_31b0;
      uStack_25a8 = uStack_31a8;
      uStack_25a0 = uStack_31a0;
      uStack_2598 = uStack_3198;
      uStack_2590 = uStack_3190;
      uStack_2588 = uStack_3188;
      local_2600[0] = -3.774895e-08;
      local_2600[1] = -3.774895e-08;
      local_2600[2] = -3.774895e-08;
      local_2600[3] = -3.774895e-08;
      local_2600[4] = -3.774895e-08;
      local_2600[5] = -3.774895e-08;
      local_2600[6] = -3.774895e-08;
      local_2600[7] = -3.774895e-08;
      local_2600[8] = -3.774895e-08;
      local_2600[9] = -3.774895e-08;
      local_2600[10] = -3.774895e-08;
      local_2600[0xb] = -3.774895e-08;
      local_2600[0xc] = -3.774895e-08;
      local_2600[0xd] = -3.774895e-08;
      local_2600[0xe] = -3.774895e-08;
      local_2600[0xf] = -3.774895e-08;
      local_2640 = local_3040._0_8_;
      uStack_2638 = local_3040._8_8_;
      uStack_2630 = local_3040._16_8_;
      uStack_2628 = local_3040._24_8_;
      uStack_2620 = local_3040._32_8_;
      uStack_2618 = local_3040._40_8_;
      uStack_2610 = local_3040._48_8_;
      uStack_2608 = local_3040._56_8_;
      auVar16._8_4_ = -3.774895e-08;
      auVar16._12_4_ = -3.774895e-08;
      auVar16._0_4_ = -3.774895e-08;
      auVar16._4_4_ = -3.774895e-08;
      auVar16._16_4_ = -3.774895e-08;
      auVar16._20_4_ = -3.774895e-08;
      auVar16._24_4_ = -3.774895e-08;
      auVar16._28_4_ = -3.774895e-08;
      auVar16._32_4_ = -3.774895e-08;
      auVar16._36_4_ = -3.774895e-08;
      auVar16._40_4_ = -3.774895e-08;
      auVar16._44_4_ = -3.774895e-08;
      auVar16._48_4_ = -3.774895e-08;
      auVar16._52_4_ = -3.774895e-08;
      auVar16._56_4_ = -3.774895e-08;
      auVar16._60_4_ = -3.774895e-08;
      local_3040 = vfmadd213ps_avx512f(auVar16,auVar104,auVar100);
      auVar100 = vmovdqa64_avx512f(auVar103);
      auVar102 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
      local_1f40 = vmovdqa64_avx512f(auVar100);
      local_1f80 = vmovdqa64_avx512f(auVar102);
      auVar100 = vmovdqa64_avx512f(local_1f40);
      auVar102 = vmovdqa64_avx512f(local_1f80);
      auVar100 = vpsubd_avx512f(auVar100,auVar102);
      auVar100 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(auVar100);
      auVar102 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_4);
      local_1a40 = vmovdqa64_avx512f(auVar100);
      local_1a80 = vmovdqa64_avx512f(auVar102);
      auVar100 = vmovdqa64_avx512f(local_1a40);
      auVar102 = vmovdqa64_avx512f(local_1a80);
      auVar100 = vpandnq_avx512f(auVar100,auVar102);
      auVar100 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(auVar100);
      local_20c0 = vmovdqa64_avx512f(auVar100);
      local_20c4 = 0x1d;
      auVar100 = vmovdqa64_avx512f(local_20c0);
      auVar100 = vpslld_avx512f(auVar100,ZEXT416(0x1d));
      local_3280 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(local_3280);
      local_3000 = vmovdqa64_avx512f(auVar100);
      auVar100 = vmovdqa64_avx512f(local_3000);
      local_3340 = vmovdqa64_avx512f(auVar100);
      local_3180._0_8_ = auVar101._0_8_;
      local_3180._8_8_ = auVar101._8_8_;
      local_3180._16_8_ = auVar101._16_8_;
      local_3180._24_8_ = auVar101._24_8_;
      local_3180._32_8_ = auVar101._32_8_;
      local_3180._40_8_ = auVar101._40_8_;
      local_3180._48_8_ = auVar101._48_8_;
      local_3180._56_8_ = auVar101._56_8_;
      local_1b40 = local_3180._0_8_;
      uStack_1b38 = local_3180._8_8_;
      uStack_1b30 = local_3180._16_8_;
      uStack_1b28 = local_3180._24_8_;
      uStack_1b20 = local_3180._32_8_;
      uStack_1b18 = local_3180._40_8_;
      uStack_1b10 = local_3180._48_8_;
      uStack_1b08 = local_3180._56_8_;
      local_1b80 = local_32c0._0_8_;
      uStack_1b78 = local_32c0._8_8_;
      uStack_1b70 = local_32c0._16_8_;
      uStack_1b68 = local_32c0._24_8_;
      uStack_1b60 = local_32c0._32_8_;
      uStack_1b58 = local_32c0._40_8_;
      uStack_1b50 = local_32c0._48_8_;
      uStack_1b48 = local_32c0._56_8_;
      auVar100 = vmovdqa64_avx512f(auVar101);
      auVar101 = vmovdqa64_avx512f(local_32c0);
      auVar100 = vpxord_avx512f(auVar100,auVar101);
      local_3180 = vmovdqa64_avx512f(auVar100);
      local_2ac0 = local_3040._0_8_;
      uStack_2ab8 = local_3040._8_8_;
      uStack_2ab0 = local_3040._16_8_;
      uStack_2aa8 = local_3040._24_8_;
      uStack_2aa0 = local_3040._32_8_;
      uStack_2a98 = local_3040._40_8_;
      uStack_2a90 = local_3040._48_8_;
      uStack_2a88 = local_3040._56_8_;
      local_2b00 = local_3040._0_8_;
      uStack_2af8 = local_3040._8_8_;
      uStack_2af0 = local_3040._16_8_;
      uStack_2ae8 = local_3040._24_8_;
      uStack_2ae0 = local_3040._32_8_;
      uStack_2ad8 = local_3040._40_8_;
      uStack_2ad0 = local_3040._48_8_;
      uStack_2ac8 = local_3040._56_8_;
      local_3380 = vmulps_avx512f(local_3040,local_3040);
      uStack_31b8._0_4_ = 2.4433157e-05;
      uStack_31b8._4_4_ = 2.4433157e-05;
      local_31c0._0_4_ = 2.4433157e-05;
      local_31c0._4_4_ = 2.4433157e-05;
      local_2680[0] = 2.4433157e-05;
      local_2680[1] = 2.4433157e-05;
      local_2680[2] = 2.4433157e-05;
      local_2680[3] = 2.4433157e-05;
      local_2680[4] = 2.4433157e-05;
      local_2680[5] = 2.4433157e-05;
      local_2680[6] = 2.4433157e-05;
      local_2680[7] = 2.4433157e-05;
      local_2680[8] = 2.4433157e-05;
      local_2680[9] = 2.4433157e-05;
      local_2680[10] = 2.4433157e-05;
      local_2680[0xb] = 2.4433157e-05;
      local_2680[0xc] = 2.4433157e-05;
      local_2680[0xd] = 2.4433157e-05;
      local_2680[0xe] = 2.4433157e-05;
      local_2680[0xf] = 2.4433157e-05;
      local_26c0 = local_3380._0_8_;
      uStack_26b8 = local_3380._8_8_;
      uStack_26b0 = local_3380._16_8_;
      uStack_26a8 = local_3380._24_8_;
      uStack_26a0 = local_3380._32_8_;
      uStack_2698 = local_3380._40_8_;
      uStack_2690 = local_3380._48_8_;
      uStack_2688 = local_3380._56_8_;
      local_2700[0] = -0.0013887316;
      local_2700[1] = -0.0013887316;
      local_2700[2] = -0.0013887316;
      local_2700[3] = -0.0013887316;
      local_2700[4] = -0.0013887316;
      local_2700[5] = -0.0013887316;
      local_2700[6] = -0.0013887316;
      local_2700[7] = -0.0013887316;
      local_2700[8] = -0.0013887316;
      local_2700[9] = -0.0013887316;
      local_2700[10] = -0.0013887316;
      local_2700[0xb] = -0.0013887316;
      local_2700[0xc] = -0.0013887316;
      local_2700[0xd] = -0.0013887316;
      local_2700[0xe] = -0.0013887316;
      local_2700[0xf] = -0.0013887316;
      auVar15._16_4_ = 2.4433157e-05;
      auVar15._20_4_ = 2.4433157e-05;
      auVar15._0_16_ = _local_31c0;
      auVar15._24_4_ = 2.4433157e-05;
      auVar15._28_4_ = 2.4433157e-05;
      auVar15._32_4_ = 2.4433157e-05;
      auVar15._36_4_ = 2.4433157e-05;
      auVar15._40_4_ = 2.4433157e-05;
      auVar15._44_4_ = 2.4433157e-05;
      auVar15._48_4_ = 2.4433157e-05;
      auVar15._52_4_ = 2.4433157e-05;
      auVar15._56_4_ = 2.4433157e-05;
      auVar15._60_4_ = 2.4433157e-05;
      auVar106._8_4_ = -0.0013887316;
      auVar106._12_4_ = -0.0013887316;
      auVar106._0_4_ = -0.0013887316;
      auVar106._4_4_ = -0.0013887316;
      auVar106._16_4_ = -0.0013887316;
      auVar106._20_4_ = -0.0013887316;
      auVar106._24_4_ = -0.0013887316;
      auVar106._28_4_ = -0.0013887316;
      auVar106._32_4_ = -0.0013887316;
      auVar106._36_4_ = -0.0013887316;
      auVar106._40_4_ = -0.0013887316;
      auVar106._44_4_ = -0.0013887316;
      auVar106._48_4_ = -0.0013887316;
      auVar106._52_4_ = -0.0013887316;
      auVar106._56_4_ = -0.0013887316;
      auVar106._60_4_ = -0.0013887316;
      auVar100 = vfmadd213ps_avx512f(local_3380,auVar15,auVar106);
      local_31c0 = auVar100._0_8_;
      uStack_31b8 = auVar100._8_8_;
      uStack_31b0 = auVar100._16_8_;
      uStack_31a8 = auVar100._24_8_;
      uStack_31a0 = auVar100._32_8_;
      uStack_3198 = auVar100._40_8_;
      uStack_3190 = auVar100._48_8_;
      uStack_3188 = auVar100._56_8_;
      local_2740 = local_31c0;
      uStack_2738 = uStack_31b8;
      uStack_2730 = uStack_31b0;
      uStack_2728 = uStack_31a8;
      uStack_2720 = uStack_31a0;
      uStack_2718 = uStack_3198;
      uStack_2710 = uStack_3190;
      uStack_2708 = uStack_3188;
      local_2780 = local_3380._0_8_;
      uStack_2778 = local_3380._8_8_;
      uStack_2770 = local_3380._16_8_;
      uStack_2768 = local_3380._24_8_;
      uStack_2760 = local_3380._32_8_;
      uStack_2758 = local_3380._40_8_;
      uStack_2750 = local_3380._48_8_;
      uStack_2748 = local_3380._56_8_;
      local_2800[0x10] = 0.041666646;
      local_2800[0x11] = 0.041666646;
      local_2800[0x12] = 0.041666646;
      local_2800[0x13] = 0.041666646;
      local_2800[0x14] = 0.041666646;
      local_2800[0x15] = 0.041666646;
      local_2800[0x16] = 0.041666646;
      local_2800[0x17] = 0.041666646;
      local_2800[0x18] = 0.041666646;
      local_2800[0x19] = 0.041666646;
      local_2800[0x1a] = 0.041666646;
      local_2800[0x1b] = 0.041666646;
      local_2800[0x1c] = 0.041666646;
      local_2800[0x1d] = 0.041666646;
      local_2800[0x1e] = 0.041666646;
      local_2800[0x1f] = 0.041666646;
      auVar104._8_4_ = 0.041666646;
      auVar104._12_4_ = 0.041666646;
      auVar104._0_4_ = 0.041666646;
      auVar104._4_4_ = 0.041666646;
      auVar104._16_4_ = 0.041666646;
      auVar104._20_4_ = 0.041666646;
      auVar104._24_4_ = 0.041666646;
      auVar104._28_4_ = 0.041666646;
      auVar104._32_4_ = 0.041666646;
      auVar104._36_4_ = 0.041666646;
      auVar104._40_4_ = 0.041666646;
      auVar104._44_4_ = 0.041666646;
      auVar104._48_4_ = 0.041666646;
      auVar104._52_4_ = 0.041666646;
      auVar104._56_4_ = 0.041666646;
      auVar104._60_4_ = 0.041666646;
      auVar100 = vfmadd213ps_avx512f(local_3380,auVar100,auVar104);
      local_31c0 = auVar100._0_8_;
      uStack_31b8 = auVar100._8_8_;
      uStack_31b0 = auVar100._16_8_;
      uStack_31a8 = auVar100._24_8_;
      uStack_31a0 = auVar100._32_8_;
      uStack_3198 = auVar100._40_8_;
      uStack_3190 = auVar100._48_8_;
      uStack_3188 = auVar100._56_8_;
      local_2b40 = local_31c0;
      uStack_2b38 = uStack_31b8;
      uStack_2b30 = uStack_31b0;
      uStack_2b28 = uStack_31a8;
      uStack_2b20 = uStack_31a0;
      uStack_2b18 = uStack_3198;
      uStack_2b10 = uStack_3190;
      uStack_2b08 = uStack_3188;
      local_2b80 = local_3380._0_8_;
      uStack_2b78 = local_3380._8_8_;
      uStack_2b70 = local_3380._16_8_;
      uStack_2b68 = local_3380._24_8_;
      uStack_2b60 = local_3380._32_8_;
      uStack_2b58 = local_3380._40_8_;
      uStack_2b50 = local_3380._48_8_;
      uStack_2b48 = local_3380._56_8_;
      auVar100 = vmulps_avx512f(auVar100,local_3380);
      local_31c0 = auVar100._0_8_;
      uStack_31b8 = auVar100._8_8_;
      uStack_31b0 = auVar100._16_8_;
      uStack_31a8 = auVar100._24_8_;
      uStack_31a0 = auVar100._32_8_;
      uStack_3198 = auVar100._40_8_;
      uStack_3190 = auVar100._48_8_;
      uStack_3188 = auVar100._56_8_;
      local_2bc0 = local_31c0;
      uStack_2bb8 = uStack_31b8;
      uStack_2bb0 = uStack_31b0;
      uStack_2ba8 = uStack_31a8;
      uStack_2ba0 = uStack_31a0;
      uStack_2b98 = uStack_3198;
      uStack_2b90 = uStack_3190;
      uStack_2b88 = uStack_3188;
      local_2c00 = local_3380._0_8_;
      uStack_2bf8 = local_3380._8_8_;
      uStack_2bf0 = local_3380._16_8_;
      uStack_2be8 = local_3380._24_8_;
      uStack_2be0 = local_3380._32_8_;
      uStack_2bd8 = local_3380._40_8_;
      uStack_2bd0 = local_3380._48_8_;
      uStack_2bc8 = local_3380._56_8_;
      auVar100 = vmulps_avx512f(auVar100,local_3380);
      local_31c0 = auVar100._0_8_;
      uStack_31b8 = auVar100._8_8_;
      uStack_31b0 = auVar100._16_8_;
      uStack_31a8 = auVar100._24_8_;
      uStack_31a0 = auVar100._32_8_;
      uStack_3198 = auVar100._40_8_;
      uStack_3190 = auVar100._48_8_;
      uStack_3188 = auVar100._56_8_;
      local_2380 = local_3380._0_8_;
      uStack_2378 = local_3380._8_8_;
      uStack_2370 = local_3380._16_8_;
      uStack_2368 = local_3380._24_8_;
      uStack_2360 = local_3380._32_8_;
      uStack_2358 = local_3380._40_8_;
      uStack_2350 = local_3380._48_8_;
      uStack_2348 = local_3380._56_8_;
      local_23c0[0] = 0.5;
      local_23c0[1] = 0.5;
      local_23c0[2] = 0.5;
      local_23c0[3] = 0.5;
      local_23c0[4] = 0.5;
      local_23c0[5] = 0.5;
      local_23c0[6] = 0.5;
      local_23c0[7] = 0.5;
      local_23c0[8] = 0.5;
      local_23c0[9] = 0.5;
      local_23c0[10] = 0.5;
      local_23c0[0xb] = 0.5;
      local_23c0[0xc] = 0.5;
      local_23c0[0xd] = 0.5;
      local_23c0[0xe] = 0.5;
      local_23c0[0xf] = 0.5;
      local_2400 = local_31c0;
      uStack_23f8 = uStack_31b8;
      uStack_23f0 = uStack_31b0;
      uStack_23e8 = uStack_31a8;
      uStack_23e0 = uStack_31a0;
      uStack_23d8 = uStack_3198;
      uStack_23d0 = uStack_3190;
      uStack_23c8 = uStack_3188;
      auVar19._8_4_ = 0.5;
      auVar19._12_4_ = 0.5;
      auVar19._0_4_ = 0.5;
      auVar19._4_4_ = 0.5;
      auVar19._16_4_ = 0.5;
      auVar19._20_4_ = 0.5;
      auVar19._24_4_ = 0.5;
      auVar19._28_4_ = 0.5;
      auVar19._32_4_ = 0.5;
      auVar19._36_4_ = 0.5;
      auVar19._40_4_ = 0.5;
      auVar19._44_4_ = 0.5;
      auVar19._48_4_ = 0.5;
      auVar19._52_4_ = 0.5;
      auVar19._56_4_ = 0.5;
      auVar19._60_4_ = 0.5;
      auVar100 = vfnmadd213ps_avx512f(auVar19,local_3380,auVar100);
      local_31c0 = auVar100._0_8_;
      uStack_31b8 = auVar100._8_8_;
      uStack_31b0 = auVar100._16_8_;
      uStack_31a8 = auVar100._24_8_;
      uStack_31a0 = auVar100._32_8_;
      uStack_3198 = auVar100._40_8_;
      uStack_3190 = auVar100._48_8_;
      uStack_3188 = auVar100._56_8_;
      local_2200 = local_31c0;
      uStack_21f8 = uStack_31b8;
      uStack_21f0 = uStack_31b0;
      uStack_21e8 = uStack_31a8;
      uStack_21e0 = uStack_31a0;
      uStack_21d8 = uStack_3198;
      uStack_21d0 = uStack_3190;
      uStack_21c8 = uStack_3188;
      local_2240[0] = 1.0;
      local_2240[1] = 1.0;
      local_2240[2] = 1.0;
      local_2240[3] = 1.0;
      local_2240[4] = 1.0;
      local_2240[5] = 1.0;
      local_2240[6] = 1.0;
      local_2240[7] = 1.0;
      local_2240[8] = 1.0;
      local_2240[9] = 1.0;
      local_2240[10] = 1.0;
      local_2240[0xb] = 1.0;
      local_2240[0xc] = 1.0;
      local_2240[0xd] = 1.0;
      local_2240[0xe] = 1.0;
      local_2240[0xf] = 1.0;
      auVar20._8_4_ = 1.0;
      auVar20._12_4_ = 1.0;
      auVar20._0_4_ = 1.0;
      auVar20._4_4_ = 1.0;
      auVar20._16_4_ = 1.0;
      auVar20._20_4_ = 1.0;
      auVar20._24_4_ = 1.0;
      auVar20._28_4_ = 1.0;
      auVar20._32_4_ = 1.0;
      auVar20._36_4_ = 1.0;
      auVar20._40_4_ = 1.0;
      auVar20._44_4_ = 1.0;
      auVar20._48_4_ = 1.0;
      auVar20._52_4_ = 1.0;
      auVar20._56_4_ = 1.0;
      auVar20._60_4_ = 1.0;
      auVar101 = vaddps_avx512f(auVar100,auVar20);
      uStack_33b8._0_4_ = -0.00019515296;
      uStack_33b8._4_4_ = -0.00019515296;
      local_33c0._0_4_ = -0.00019515296;
      local_33c0._4_4_ = -0.00019515296;
      local_2800[0] = -0.00019515296;
      local_2800[1] = -0.00019515296;
      local_2800[2] = -0.00019515296;
      local_2800[3] = -0.00019515296;
      local_2800[4] = -0.00019515296;
      local_2800[5] = -0.00019515296;
      local_2800[6] = -0.00019515296;
      local_2800[7] = -0.00019515296;
      local_2800[8] = -0.00019515296;
      local_2800[9] = -0.00019515296;
      local_2800[10] = -0.00019515296;
      local_2800[0xb] = -0.00019515296;
      local_2800[0xc] = -0.00019515296;
      local_2800[0xd] = -0.00019515296;
      local_2800[0xe] = -0.00019515296;
      local_2800[0xf] = -0.00019515296;
      local_2840 = local_3380._0_8_;
      uStack_2838 = local_3380._8_8_;
      uStack_2830 = local_3380._16_8_;
      uStack_2828 = local_3380._24_8_;
      uStack_2820 = local_3380._32_8_;
      uStack_2818 = local_3380._40_8_;
      uStack_2810 = local_3380._48_8_;
      uStack_2808 = local_3380._56_8_;
      local_2880[0] = 0.008332161;
      local_2880[1] = 0.008332161;
      local_2880[2] = 0.008332161;
      local_2880[3] = 0.008332161;
      local_2880[4] = 0.008332161;
      local_2880[5] = 0.008332161;
      local_2880[6] = 0.008332161;
      local_2880[7] = 0.008332161;
      local_2880[8] = 0.008332161;
      local_2880[9] = 0.008332161;
      local_2880[10] = 0.008332161;
      local_2880[0xb] = 0.008332161;
      local_2880[0xc] = 0.008332161;
      local_2880[0xd] = 0.008332161;
      local_2880[0xe] = 0.008332161;
      local_2880[0xf] = 0.008332161;
      auVar105._16_4_ = -0.00019515296;
      auVar105._20_4_ = -0.00019515296;
      auVar105._0_16_ = _local_33c0;
      auVar105._24_4_ = -0.00019515296;
      auVar105._28_4_ = -0.00019515296;
      auVar105._32_4_ = -0.00019515296;
      auVar105._36_4_ = -0.00019515296;
      auVar105._40_4_ = -0.00019515296;
      auVar105._44_4_ = -0.00019515296;
      auVar105._48_4_ = -0.00019515296;
      auVar105._52_4_ = -0.00019515296;
      auVar105._56_4_ = -0.00019515296;
      auVar105._60_4_ = -0.00019515296;
      auVar103._8_4_ = 0.008332161;
      auVar103._12_4_ = 0.008332161;
      auVar103._0_4_ = 0.008332161;
      auVar103._4_4_ = 0.008332161;
      auVar103._16_4_ = 0.008332161;
      auVar103._20_4_ = 0.008332161;
      auVar103._24_4_ = 0.008332161;
      auVar103._28_4_ = 0.008332161;
      auVar103._32_4_ = 0.008332161;
      auVar103._36_4_ = 0.008332161;
      auVar103._40_4_ = 0.008332161;
      auVar103._44_4_ = 0.008332161;
      auVar103._48_4_ = 0.008332161;
      auVar103._52_4_ = 0.008332161;
      auVar103._56_4_ = 0.008332161;
      auVar103._60_4_ = 0.008332161;
      auVar102 = vfmadd213ps_avx512f(local_3380,auVar105,auVar103);
      local_33c0 = auVar102._0_8_;
      uStack_33b8 = auVar102._8_8_;
      uStack_33b0 = auVar102._16_8_;
      uStack_33a8 = auVar102._24_8_;
      uStack_33a0 = auVar102._32_8_;
      uStack_3398 = auVar102._40_8_;
      uStack_3390 = auVar102._48_8_;
      uStack_3388 = auVar102._56_8_;
      local_28c0 = local_33c0;
      uStack_28b8 = uStack_33b8;
      uStack_28b0 = uStack_33b0;
      uStack_28a8 = uStack_33a8;
      uStack_28a0 = uStack_33a0;
      uStack_2898 = uStack_3398;
      uStack_2890 = uStack_3390;
      uStack_2888 = uStack_3388;
      local_2900 = local_3380._0_8_;
      uStack_28f8 = local_3380._8_8_;
      uStack_28f0 = local_3380._16_8_;
      uStack_28e8 = local_3380._24_8_;
      uStack_28e0 = local_3380._32_8_;
      uStack_28d8 = local_3380._40_8_;
      uStack_28d0 = local_3380._48_8_;
      uStack_28c8 = local_3380._56_8_;
      local_2940[0] = -0.16666655;
      local_2940[1] = -0.16666655;
      local_2940[2] = -0.16666655;
      local_2940[3] = -0.16666655;
      local_2940[4] = -0.16666655;
      local_2940[5] = -0.16666655;
      local_2940[6] = -0.16666655;
      local_2940[7] = -0.16666655;
      local_2940[8] = -0.16666655;
      local_2940[9] = -0.16666655;
      local_2940[10] = -0.16666655;
      local_2940[0xb] = -0.16666655;
      local_2940[0xc] = -0.16666655;
      local_2940[0xd] = -0.16666655;
      local_2940[0xe] = -0.16666655;
      local_2940[0xf] = -0.16666655;
      auVar100._8_4_ = -0.16666655;
      auVar100._12_4_ = -0.16666655;
      auVar100._0_4_ = -0.16666655;
      auVar100._4_4_ = -0.16666655;
      auVar100._16_4_ = -0.16666655;
      auVar100._20_4_ = -0.16666655;
      auVar100._24_4_ = -0.16666655;
      auVar100._28_4_ = -0.16666655;
      auVar100._32_4_ = -0.16666655;
      auVar100._36_4_ = -0.16666655;
      auVar100._40_4_ = -0.16666655;
      auVar100._44_4_ = -0.16666655;
      auVar100._48_4_ = -0.16666655;
      auVar100._52_4_ = -0.16666655;
      auVar100._56_4_ = -0.16666655;
      auVar100._60_4_ = -0.16666655;
      auVar100 = vfmadd213ps_avx512f(local_3380,auVar102,auVar100);
      local_33c0 = auVar100._0_8_;
      uStack_33b8 = auVar100._8_8_;
      uStack_33b0 = auVar100._16_8_;
      uStack_33a8 = auVar100._24_8_;
      uStack_33a0 = auVar100._32_8_;
      uStack_3398 = auVar100._40_8_;
      uStack_3390 = auVar100._48_8_;
      uStack_3388 = auVar100._56_8_;
      local_2c40 = local_33c0;
      uStack_2c38 = uStack_33b8;
      uStack_2c30 = uStack_33b0;
      uStack_2c28 = uStack_33a8;
      uStack_2c20 = uStack_33a0;
      uStack_2c18 = uStack_3398;
      uStack_2c10 = uStack_3390;
      uStack_2c08 = uStack_3388;
      local_2c80 = local_3380._0_8_;
      uStack_2c78 = local_3380._8_8_;
      uStack_2c70 = local_3380._16_8_;
      uStack_2c68 = local_3380._24_8_;
      uStack_2c60 = local_3380._32_8_;
      uStack_2c58 = local_3380._40_8_;
      uStack_2c50 = local_3380._48_8_;
      uStack_2c48 = local_3380._56_8_;
      auVar100 = vmulps_avx512f(auVar100,local_3380);
      local_33c0 = auVar100._0_8_;
      uStack_33b8 = auVar100._8_8_;
      uStack_33b0 = auVar100._16_8_;
      uStack_33a8 = auVar100._24_8_;
      uStack_33a0 = auVar100._32_8_;
      uStack_3398 = auVar100._40_8_;
      uStack_3390 = auVar100._48_8_;
      uStack_3388 = auVar100._56_8_;
      local_2980 = local_33c0;
      uStack_2978 = uStack_33b8;
      uStack_2970 = uStack_33b0;
      uStack_2968 = uStack_33a8;
      uStack_2960 = uStack_33a0;
      uStack_2958 = uStack_3398;
      uStack_2950 = uStack_3390;
      uStack_2948 = uStack_3388;
      local_29c0 = local_3040._0_8_;
      uStack_29b8 = local_3040._8_8_;
      uStack_29b0 = local_3040._16_8_;
      uStack_29a8 = local_3040._24_8_;
      uStack_29a0 = local_3040._32_8_;
      uStack_2998 = local_3040._40_8_;
      uStack_2990 = local_3040._48_8_;
      uStack_2988 = local_3040._56_8_;
      local_2a00 = local_3040._0_8_;
      uStack_29f8 = local_3040._8_8_;
      uStack_29f0 = local_3040._16_8_;
      uStack_29e8 = local_3040._24_8_;
      uStack_29e0 = local_3040._32_8_;
      uStack_29d8 = local_3040._40_8_;
      uStack_29d0 = local_3040._48_8_;
      uStack_29c8 = local_3040._56_8_;
      auVar100 = vfmadd213ps_avx512f(local_3040,auVar100,local_3040);
      local_3140 = local_3300._0_8_;
      uStack_3138 = local_3300._8_8_;
      uStack_3130 = local_3300._16_8_;
      uStack_3128 = local_3300._24_8_;
      uStack_3120 = local_3300._32_8_;
      uStack_3118 = local_3300._40_8_;
      uStack_3110 = local_3300._48_8_;
      uStack_3108 = local_3300._56_8_;
      local_33c0 = auVar100._0_8_;
      uStack_33b8 = auVar100._8_8_;
      uStack_33b0 = auVar100._16_8_;
      uStack_33a8 = auVar100._24_8_;
      uStack_33a0 = auVar100._32_8_;
      uStack_3398 = auVar100._40_8_;
      uStack_3390 = auVar100._48_8_;
      uStack_3388 = auVar100._56_8_;
      local_2e40 = local_3300._0_8_;
      uStack_2e38 = local_3300._8_8_;
      uStack_2e30 = local_3300._16_8_;
      uStack_2e28 = local_3300._24_8_;
      uStack_2e20 = local_3300._32_8_;
      uStack_2e18 = local_3300._40_8_;
      uStack_2e10 = local_3300._48_8_;
      uStack_2e08 = local_3300._56_8_;
      local_2e80 = local_33c0;
      uStack_2e78 = uStack_33b8;
      uStack_2e70 = uStack_33b0;
      uStack_2e68 = uStack_33a8;
      uStack_2e60 = uStack_33a0;
      uStack_2e58 = uStack_3398;
      uStack_2e50 = uStack_3390;
      uStack_2e48 = uStack_3388;
      auVar102 = vmovdqa64_avx512f(local_3300);
      auVar103 = vmovdqa64_avx512f(auVar100);
      auVar102 = vpandd_avx512f(auVar102,auVar103);
      local_3400 = vmovdqa64_avx512f(auVar102);
      local_31c0 = auVar101._0_8_;
      uStack_31b8 = auVar101._8_8_;
      uStack_31b0 = auVar101._16_8_;
      uStack_31a8 = auVar101._24_8_;
      uStack_31a0 = auVar101._32_8_;
      uStack_3198 = auVar101._40_8_;
      uStack_3190 = auVar101._48_8_;
      uStack_3188 = auVar101._56_8_;
      local_1ac0 = local_3300._0_8_;
      uStack_1ab8 = local_3300._8_8_;
      uStack_1ab0 = local_3300._16_8_;
      uStack_1aa8 = local_3300._24_8_;
      uStack_1aa0 = local_3300._32_8_;
      uStack_1a98 = local_3300._40_8_;
      uStack_1a90 = local_3300._48_8_;
      uStack_1a88 = local_3300._56_8_;
      local_1b00 = local_31c0;
      uStack_1af8 = uStack_31b8;
      uStack_1af0 = uStack_31b0;
      uStack_1ae8 = uStack_31a8;
      uStack_1ae0 = uStack_31a0;
      uStack_1ad8 = uStack_3198;
      uStack_1ad0 = uStack_3190;
      uStack_1ac8 = uStack_3188;
      auVar102 = vmovdqa64_avx512f(local_3300);
      auVar103 = vmovdqa64_avx512f(auVar101);
      auVar102 = vpandnd_avx512f(auVar102,auVar103);
      local_3440 = vmovdqa64_avx512f(auVar102);
      local_2cc0 = local_33c0;
      uStack_2cb8 = uStack_33b8;
      uStack_2cb0 = uStack_33b0;
      uStack_2ca8 = uStack_33a8;
      uStack_2ca0 = uStack_33a0;
      uStack_2c98 = uStack_3398;
      uStack_2c90 = uStack_3390;
      uStack_2c88 = uStack_3388;
      local_2d00 = local_3400._0_8_;
      uStack_2cf8 = local_3400._8_8_;
      uStack_2cf0 = local_3400._16_8_;
      uStack_2ce8 = local_3400._24_8_;
      uStack_2ce0 = local_3400._32_8_;
      uStack_2cd8 = local_3400._40_8_;
      uStack_2cd0 = local_3400._48_8_;
      uStack_2cc8 = local_3400._56_8_;
      _local_33c0 = vsubps_avx512f(auVar100,local_3400);
      local_2d40 = local_31c0;
      uStack_2d38 = uStack_31b8;
      uStack_2d30 = uStack_31b0;
      uStack_2d28 = uStack_31a8;
      uStack_2d20 = uStack_31a0;
      uStack_2d18 = uStack_3198;
      uStack_2d10 = uStack_3190;
      uStack_2d08 = uStack_3188;
      local_2d80 = local_3440._0_8_;
      uStack_2d78 = local_3440._8_8_;
      uStack_2d70 = local_3440._16_8_;
      uStack_2d68 = local_3440._24_8_;
      uStack_2d60 = local_3440._32_8_;
      uStack_2d58 = local_3440._40_8_;
      uStack_2d50 = local_3440._48_8_;
      uStack_2d48 = local_3440._56_8_;
      _local_31c0 = vsubps_avx512f(auVar101,local_3440);
      local_2280 = local_3440._0_8_;
      uStack_2278 = local_3440._8_8_;
      uStack_2270 = local_3440._16_8_;
      uStack_2268 = local_3440._24_8_;
      uStack_2260 = local_3440._32_8_;
      uStack_2258 = local_3440._40_8_;
      uStack_2250 = local_3440._48_8_;
      uStack_2248 = local_3440._56_8_;
      local_22c0 = local_3400._0_8_;
      uStack_22b8 = local_3400._8_8_;
      uStack_22b0 = local_3400._16_8_;
      uStack_22a8 = local_3400._24_8_;
      uStack_22a0 = local_3400._32_8_;
      uStack_2298 = local_3400._40_8_;
      uStack_2290 = local_3400._48_8_;
      uStack_2288 = local_3400._56_8_;
      _local_30c0 = vaddps_avx512f(local_3440,local_3400);
      local_2300 = local_31c0;
      uStack_22f8 = uStack_31b8;
      uStack_22f0 = uStack_31b0;
      uStack_22e8 = uStack_31a8;
      uStack_22e0 = uStack_31a0;
      uStack_22d8 = uStack_3198;
      uStack_22d0 = uStack_3190;
      uStack_22c8 = uStack_3188;
      local_2340 = local_33c0;
      uStack_2338 = uStack_33b8;
      uStack_2330 = uStack_33b0;
      uStack_2328 = uStack_33a8;
      uStack_2320 = uStack_33a0;
      uStack_2318 = uStack_3398;
      uStack_2310 = uStack_3390;
      uStack_2308 = uStack_3388;
      _local_3100 = vaddps_avx512f(_local_31c0,_local_33c0);
      local_1bc0 = local_30c0;
      uStack_1bb8 = uStack_30b8;
      uStack_1bb0 = uStack_30b0;
      uStack_1ba8 = uStack_30a8;
      uStack_1ba0 = uStack_30a0;
      uStack_1b98 = uStack_3098;
      uStack_1b90 = uStack_3090;
      uStack_1b88 = uStack_3088;
      local_1c00 = local_3180._0_8_;
      uStack_1bf8 = local_3180._8_8_;
      uStack_1bf0 = local_3180._16_8_;
      uStack_1be8 = local_3180._24_8_;
      uStack_1be0 = local_3180._32_8_;
      uStack_1bd8 = local_3180._40_8_;
      uStack_1bd0 = local_3180._48_8_;
      uStack_1bc8 = local_3180._56_8_;
      auVar100 = vmovdqa64_avx512f(_local_30c0);
      auVar101 = vmovdqa64_avx512f(local_3180);
      auVar100 = vpxord_avx512f(auVar100,auVar101);
      auVar100 = vmovdqa64_avx512f(auVar100);
      local_1c40 = local_3100;
      uStack_1c38 = uStack_30f8;
      uStack_1c30 = uStack_30f0;
      uStack_1c28 = uStack_30e8;
      uStack_1c20 = uStack_30e0;
      uStack_1c18 = uStack_30d8;
      uStack_1c10 = uStack_30d0;
      uStack_1c08 = uStack_30c8;
      local_1c80 = local_3340._0_8_;
      uStack_1c78 = local_3340._8_8_;
      uStack_1c70 = local_3340._16_8_;
      uStack_1c68 = local_3340._24_8_;
      uStack_1c60 = local_3340._32_8_;
      uStack_1c58 = local_3340._40_8_;
      uStack_1c50 = local_3340._48_8_;
      uStack_1c48 = local_3340._56_8_;
      auVar101 = vmovdqa64_avx512f(_local_3100);
      auVar102 = vmovdqa64_avx512f(local_3340);
      auVar101 = vpxord_avx512f(auVar101,auVar102);
      auVar101 = vmovdqa64_avx512f(auVar101);
      uStack_3704 = auVar101._60_4_;
      uStack_3708 = auVar101._56_4_;
      uStack_370c = auVar101._52_4_;
      uStack_3710 = auVar101._48_4_;
      uStack_3714 = auVar101._44_4_;
      uStack_3718 = auVar101._40_4_;
      uStack_371c = auVar101._36_4_;
      uStack_3720 = auVar101._32_4_;
      uStack_3724 = auVar101._28_4_;
      uStack_3728 = auVar101._24_4_;
      uStack_372c = auVar101._20_4_;
      uStack_3730 = auVar101._16_4_;
      uStack_3734 = auVar101._12_4_;
      uStack_3738 = auVar101._8_4_;
      uStack_373c = auVar101._4_4_;
      local_3740 = auVar101._0_4_;
      local_3600 = auVar101._0_8_;
      local_3680 = 0;
      uStack_3678 = 0;
      uStack_3670 = 0;
      uStack_3668 = 0;
      uStack_3660 = 0;
      uStack_3658 = 0;
      uStack_3650 = 0;
      uStack_3648 = 0;
      uVar13 = vcmpps_avx512f(auVar101,ZEXT1664(ZEXT816(0)),0);
      local_3782 = (ushort)uVar13;
      uStack_35f8 = auVar101._8_8_;
      uStack_35f0 = auVar101._16_8_;
      uStack_35e8 = auVar101._24_8_;
      uStack_35e0 = auVar101._32_8_;
      uStack_35d8 = auVar101._40_8_;
      uStack_35d0 = auVar101._48_8_;
      uStack_35c8 = auVar101._56_8_;
      local_3640 = local_34c0._0_8_;
      uStack_3638 = local_34c0._8_8_;
      uStack_3630 = local_34c0._16_8_;
      uStack_3628 = local_34c0._24_8_;
      uStack_3620 = local_34c0._32_8_;
      uStack_3618 = local_34c0._40_8_;
      uStack_3610 = local_34c0._48_8_;
      uStack_3608 = local_34c0._56_8_;
      local_3540 = local_34c0._0_8_;
      uStack_3538 = local_34c0._8_8_;
      uStack_3530 = local_34c0._16_8_;
      uStack_3528 = local_34c0._24_8_;
      uStack_3520 = local_34c0._32_8_;
      uStack_3518 = local_34c0._40_8_;
      uStack_3510 = local_34c0._48_8_;
      uStack_3508 = local_34c0._56_8_;
      auVar101 = vaddps_avx512f(auVar101,local_34c0);
      bVar1 = (bool)((byte)uVar13 & 1);
      local_3740 = (uint)bVar1 * auVar101._0_4_ | !bVar1 * local_3740;
      bVar1 = (bool)((byte)(local_3782 >> 1) & 1);
      uStack_373c = (uint)bVar1 * auVar101._4_4_ | !bVar1 * uStack_373c;
      bVar1 = (bool)((byte)(local_3782 >> 2) & 1);
      uStack_3738 = (uint)bVar1 * auVar101._8_4_ | !bVar1 * uStack_3738;
      bVar1 = (bool)((byte)(local_3782 >> 3) & 1);
      uStack_3734 = (uint)bVar1 * auVar101._12_4_ | !bVar1 * uStack_3734;
      bVar1 = (bool)((byte)(local_3782 >> 4) & 1);
      uStack_3730 = (uint)bVar1 * auVar101._16_4_ | !bVar1 * uStack_3730;
      bVar1 = (bool)((byte)(local_3782 >> 5) & 1);
      uStack_372c = (uint)bVar1 * auVar101._20_4_ | !bVar1 * uStack_372c;
      bVar1 = (bool)((byte)(local_3782 >> 6) & 1);
      uStack_3728 = (uint)bVar1 * auVar101._24_4_ | !bVar1 * uStack_3728;
      bVar1 = (bool)((byte)(local_3782 >> 7) & 1);
      uStack_3724 = (uint)bVar1 * auVar101._28_4_ | !bVar1 * uStack_3724;
      bVar2 = (byte)((ulong)uVar13 >> 8);
      uStack_3720 = (uint)(bVar2 & 1) * auVar101._32_4_ | !(bool)(bVar2 & 1) * uStack_3720;
      bVar1 = (bool)(bVar2 >> 1 & 1);
      uStack_371c = (uint)bVar1 * auVar101._36_4_ | !bVar1 * uStack_371c;
      bVar1 = (bool)(bVar2 >> 2 & 1);
      uStack_3718 = (uint)bVar1 * auVar101._40_4_ | !bVar1 * uStack_3718;
      bVar1 = (bool)(bVar2 >> 3 & 1);
      uStack_3714 = (uint)bVar1 * auVar101._44_4_ | !bVar1 * uStack_3714;
      bVar1 = (bool)(bVar2 >> 4 & 1);
      uStack_3710 = (uint)bVar1 * auVar101._48_4_ | !bVar1 * uStack_3710;
      bVar1 = (bool)(bVar2 >> 5 & 1);
      uStack_370c = (uint)bVar1 * auVar101._52_4_ | !bVar1 * uStack_370c;
      bVar1 = (bool)(bVar2 >> 6 & 1);
      uStack_3708 = (uint)bVar1 * auVar101._56_4_ | !bVar1 * uStack_3708;
      uStack_3704 = (uint)(bVar2 >> 7) * auVar101._60_4_ | !(bool)(bVar2 >> 7) * uStack_3704;
      local_1a00 = CONCAT44(uStack_373c,local_3740);
      uStack_19f8 = CONCAT44(uStack_3734,uStack_3738);
      uStack_19f0 = CONCAT44(uStack_372c,uStack_3730);
      uStack_19e8 = CONCAT44(uStack_3724,uStack_3728);
      uStack_19e0 = CONCAT44(uStack_371c,uStack_3720);
      uStack_19d8 = CONCAT44(uStack_3714,uStack_3718);
      uStack_19d0 = CONCAT44(uStack_370c,uStack_3710);
      uStack_19c8 = CONCAT44(uStack_3704,uStack_3708);
      auVar21._8_8_ = uStack_19f8;
      auVar21._0_8_ = local_1a00;
      auVar21._16_8_ = uStack_19f0;
      auVar21._24_8_ = uStack_19e8;
      auVar21._32_8_ = uStack_19e0;
      auVar21._40_8_ = uStack_19d8;
      auVar21._48_8_ = uStack_19d0;
      auVar21._56_8_ = uStack_19c8;
      local_3800 = vdivps_avx512f(auVar100,auVar21);
      local_3a80 = local_3800._0_8_;
      uStack_3a78 = local_3800._8_8_;
      uStack_3a70 = local_3800._16_8_;
      uStack_3a68 = local_3800._24_8_;
      uStack_3a60 = local_3800._32_8_;
      uStack_3a58 = local_3800._40_8_;
      uStack_3a50 = local_3800._48_8_;
      uStack_3a48 = local_3800._56_8_;
      local_3910 = local_39f0;
      local_3980 = local_3800._0_8_;
      uStack_3978 = local_3800._8_8_;
      uStack_3970 = local_3800._16_8_;
      uStack_3968 = local_3800._24_8_;
      uStack_3960 = local_3800._32_8_;
      uStack_3958 = local_3800._40_8_;
      uStack_3950 = local_3800._48_8_;
      uStack_3948 = local_3800._56_8_;
      *local_39f0 = local_3800;
      local_39f0 = local_39f0 + 1;
      local_3582 = local_3782;
      local_3580 = local_3600;
      uStack_3578 = uStack_35f8;
      uStack_3570 = uStack_35f0;
      uStack_3568 = uStack_35e8;
      uStack_3560 = uStack_35e0;
      uStack_3558 = uStack_35d8;
      uStack_3550 = uStack_35d0;
      uStack_3548 = uStack_35c8;
      local_3500 = local_3600;
      uStack_34f8 = uStack_35f8;
      uStack_34f0 = uStack_35f0;
      uStack_34e8 = uStack_35e8;
      uStack_34e0 = uStack_35e0;
      uStack_34d8 = uStack_35d8;
      uStack_34d0 = uStack_35d0;
      uStack_34c8 = uStack_35c8;
      uStack_2d90 = uStack_3690;
      uStack_2d88 = uStack_3688;
      uStack_1f90 = uStack_3690;
      uStack_1f88 = uStack_3688;
      uStack_1e10 = uStack_3690;
      uStack_1e08 = uStack_3688;
    }
    for (; uStack_1648 = uVar93, uStack_1650 = uVar92, uStack_1658 = uVar91, local_1660 = uVar13,
        uVar97 = uStack_1648._4_4_, uVar96 = uStack_1650._4_4_, uVar95 = uStack_1658._4_4_,
        uVar94 = local_1660._4_4_, uVar13 = local_720, uVar91 = uStack_718,
        local_3a3c + 7 < local_39e4; local_3a3c = local_3a3c + 8) {
      local_3908 = local_39f0;
      local_18c0 = *(undefined8 *)*local_39f0;
      uStack_18b8 = *(undefined8 *)(*local_39f0 + 8);
      uStack_18b0 = *(undefined8 *)(*local_39f0 + 0x10);
      uStack_18a8 = *(undefined8 *)(*local_39f0 + 0x18);
      local_3828 = local_39c9;
      local_3830 = &local_3aa0;
      local_17e4 = 0x322bcc77;
      local_8c4 = 0x322bcc77;
      local_8c8 = 0x322bcc77;
      local_8cc = 0x322bcc77;
      local_8d0 = 0x322bcc77;
      local_8d4 = 0x322bcc77;
      local_8d8 = 0x322bcc77;
      local_8dc = 0x322bcc77;
      local_8e0 = 0x322bcc77;
      auVar3 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x20);
      local_900 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x20);
      auStack_8f0 = vinsertps_avx(auVar3,ZEXT416(0x322bcc77),0x30);
      local_1920 = local_900._0_8_;
      uStack_1918 = local_900._8_8_;
      uStack_1910 = auStack_8f0._0_8_;
      uStack_1908 = auStack_8f0._8_8_;
      local_15e8 = local_18e0;
      local_15f0 = &local_1900;
      local_1420 = 0;
      uStack_1418 = 0;
      uStack_1410 = 0;
      uStack_1408 = 0;
      local_15e0._0_8_ = SUB168(*(undefined1 (*) [16])*local_39f0,0);
      local_15e0._8_8_ = SUB168(*(undefined1 (*) [16])*local_39f0,8);
      local_14c0 = local_15e0._0_8_;
      uStack_14b8 = local_15e0._8_8_;
      local_14e0 = 0x7fffffff;
      uStack_14dc = 0x7fffffff;
      uStack_14d8 = 0x7fffffff;
      uStack_14d4 = 0x7fffffff;
      uStack_14d0 = 0x7fffffff;
      uStack_14cc = 0x7fffffff;
      uStack_14c8 = 0x7fffffff;
      uStack_14c4 = 0x7fffffff;
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar11._16_4_ = 0x7fffffff;
      auVar11._20_4_ = 0x7fffffff;
      auVar11._24_4_ = 0x7fffffff;
      auVar11._28_4_ = 0x7fffffff;
      auVar9 = vpand_avx2(*(undefined1 (*) [32])*local_39f0,auVar11);
      local_1500 = local_15e0._0_8_;
      uStack_14f8 = local_15e0._8_8_;
      local_1520 = 0x80000000;
      uStack_151c = 0x80000000;
      uStack_1518 = 0x80000000;
      uStack_1514 = 0x80000000;
      uStack_1510 = 0x80000000;
      uStack_150c = 0x80000000;
      uStack_1508 = 0x80000000;
      uStack_1504 = 0x80000000;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar10._16_4_ = 0x80000000;
      auVar10._20_4_ = 0x80000000;
      auVar10._24_4_ = 0x80000000;
      auVar10._28_4_ = 0x80000000;
      auVar10 = vpand_avx2(*(undefined1 (*) [32])*local_39f0,auVar10);
      local_15e0._0_8_ = auVar9._0_8_;
      local_15e0._8_8_ = auVar9._8_8_;
      local_15e0._16_8_ = auVar9._16_8_;
      local_15e0._24_8_ = auVar9._24_8_;
      local_12e0 = local_15e0._0_8_;
      uVar69 = local_12e0;
      uStack_12d8 = local_15e0._8_8_;
      uVar70 = uStack_12d8;
      uStack_12d0 = local_15e0._16_8_;
      uVar71 = uStack_12d0;
      uStack_12c8 = local_15e0._24_8_;
      uVar72 = uStack_12c8;
      local_1300 = 0x3fa2f983;
      uStack_12fc = 0x3fa2f983;
      uStack_12f8 = 0x3fa2f983;
      uStack_12f4 = 0x3fa2f983;
      uStack_12f0 = 0x3fa2f983;
      uStack_12ec = 0x3fa2f983;
      uStack_12e8 = 0x3fa2f983;
      uStack_12e4 = 0x3fa2f983;
      local_12e0._0_4_ = auVar9._0_4_;
      local_12e0._4_4_ = auVar9._4_4_;
      uStack_12d8._0_4_ = auVar9._8_4_;
      uStack_12d8._4_4_ = auVar9._12_4_;
      uStack_12d0._0_4_ = auVar9._16_4_;
      uStack_12d0._4_4_ = auVar9._20_4_;
      uStack_12c8._0_4_ = auVar9._24_4_;
      uStack_12c8._4_4_ = auVar9._28_4_;
      local_16a0._4_4_ = local_12e0._4_4_ * 1.2732395;
      local_16a0._0_4_ = (float)local_12e0 * 1.2732395;
      uStack_1698._0_4_ = (float)uStack_12d8 * 1.2732395;
      uStack_1698._4_4_ = uStack_12d8._4_4_ * 1.2732395;
      uStack_1690._0_4_ = (float)uStack_12d0 * 1.2732395;
      uStack_1690._4_4_ = uStack_12d0._4_4_ * 1.2732395;
      auVar61 = _local_16a0;
      uStack_1688._0_4_ = (float)uStack_12c8 * 1.2732395;
      uStack_1688._4_4_ = uStack_12c8._4_4_;
      auVar8 = _local_16a0;
      uStack_1690 = auVar61._16_8_;
      uStack_1688 = auVar8._24_8_;
      local_1120 = local_16a0;
      uStack_1118 = uStack_1698;
      uStack_1110 = uStack_1690;
      uStack_1108 = uStack_1688;
      local_16e0._4_4_ = (int)(local_12e0._4_4_ * 1.2732395);
      local_16e0._0_4_ = (int)((float)local_12e0 * 1.2732395);
      local_16e0._8_4_ = (int)((float)uStack_12d8 * 1.2732395);
      local_16e0._12_4_ = (int)(uStack_12d8._4_4_ * 1.2732395);
      local_16e0._16_4_ = (int)((float)uStack_12d0 * 1.2732395);
      local_16e0._20_4_ = (int)(uStack_12d0._4_4_ * 1.2732395);
      auVar61 = local_16e0._0_24_;
      local_16e0._24_4_ = (int)((float)uStack_12c8 * 1.2732395);
      local_16e0._28_4_ = (int)uStack_12c8._4_4_;
      auVar8 = local_16e0;
      local_16e0._16_8_ = auVar61._16_8_;
      local_16e0._24_8_ = auVar8._24_8_;
      local_10e0 = local_16e0._0_8_;
      uStack_10d8 = local_16e0._8_8_;
      uStack_10d0 = local_16e0._16_8_;
      uStack_10c8 = local_16e0._24_8_;
      local_1100 = 0x100000001;
      uStack_10f8 = 0x100000001;
      uStack_10f0 = 0x100000001;
      uStack_10e8 = 0x100000001;
      local_cc0 = local_16e0._0_8_;
      uStack_cb8 = local_16e0._8_8_;
      uStack_cb0 = local_16e0._16_8_;
      uStack_ca8 = local_16e0._24_8_;
      local_ce0 = 0x100000001;
      uStack_cd8 = 0x100000001;
      uStack_cd0 = 0x100000001;
      uStack_cc8 = 0x100000001;
      auVar27._16_8_ = local_16e0._16_8_;
      auVar27._0_16_ = local_16e0._0_16_;
      auVar27._24_8_ = local_16e0._24_8_;
      auVar108._8_8_ = 0x100000001;
      auVar108._0_8_ = 0x100000001;
      auVar108._16_8_ = 0x100000001;
      auVar108._24_8_ = 0x100000001;
      auVar8 = vpaddd_avx2(auVar27,auVar108);
      local_16e0._0_8_ = auVar8._0_8_;
      local_16e0._8_8_ = auVar8._8_8_;
      local_16e0._16_8_ = auVar8._16_8_;
      local_16e0._24_8_ = auVar8._24_8_;
      local_ae0 = local_16e0._0_8_;
      uStack_ad8 = local_16e0._8_8_;
      uStack_ad0 = local_16e0._16_8_;
      uStack_ac8 = local_16e0._24_8_;
      local_b00 = 0xfffffffefffffffe;
      uStack_af8 = 0xfffffffefffffffe;
      uStack_af0 = 0xfffffffefffffffe;
      uStack_ae8 = 0xfffffffefffffffe;
      auVar31._8_8_ = 0xfffffffefffffffe;
      auVar31._0_8_ = 0xfffffffefffffffe;
      auVar31._16_8_ = 0xfffffffefffffffe;
      auVar31._24_8_ = 0xfffffffefffffffe;
      auVar11 = vpand_avx2(auVar8,auVar31);
      local_16e0._0_8_ = auVar11._0_8_;
      local_c00 = local_16e0._0_8_;
      local_16e0._8_8_ = auVar11._8_8_;
      uStack_bf8 = local_16e0._8_8_;
      local_16e0._16_8_ = auVar11._16_8_;
      uStack_bf0 = local_16e0._16_8_;
      local_16e0._24_8_ = auVar11._24_8_;
      uStack_be8 = local_16e0._24_8_;
      local_be0 = local_16e0._0_8_;
      uStack_bd8 = local_16e0._8_8_;
      uStack_bd0 = local_16e0._16_8_;
      uStack_bc8 = local_16e0._24_8_;
      auVar8 = vcvtdq2ps_avx(auVar11);
      local_b20 = local_16e0._0_8_;
      uStack_b18 = local_16e0._8_8_;
      uStack_b10 = local_16e0._16_8_;
      uStack_b08 = local_16e0._24_8_;
      local_b40 = 0x400000004;
      uStack_b38 = 0x400000004;
      uStack_b30 = 0x400000004;
      uStack_b28 = 0x400000004;
      auVar30._8_8_ = 0x400000004;
      auVar30._0_8_ = 0x400000004;
      auVar30._16_8_ = 0x400000004;
      auVar30._24_8_ = 0x400000004;
      auVar12 = vpand_avx2(auVar11,auVar30);
      local_16c0._0_8_ = auVar12._0_8_;
      local_16c0._8_8_ = auVar12._8_8_;
      local_16c0._16_8_ = auVar12._16_8_;
      local_16c0._24_8_ = auVar12._24_8_;
      local_1060 = local_16c0._0_8_;
      uStack_1058 = local_16c0._8_8_;
      uStack_1050 = local_16c0._16_8_;
      uStack_1048 = local_16c0._24_8_;
      local_1064 = 0x1d;
      local_c80 = local_16c0._0_8_;
      uStack_c78 = local_16c0._8_8_;
      uStack_c70 = local_16c0._16_8_;
      uStack_c68 = local_16c0._24_8_;
      local_c84 = 0x1d;
      local_16c0 = vpslld_avx2(auVar12,ZEXT416(0x1d));
      local_b60 = local_16e0._0_8_;
      uStack_b58 = local_16e0._8_8_;
      uStack_b50 = local_16e0._16_8_;
      uStack_b48 = local_16e0._24_8_;
      local_b80 = 0x200000002;
      uStack_b78 = 0x200000002;
      uStack_b70 = 0x200000002;
      uStack_b68 = 0x200000002;
      auVar29._8_8_ = 0x200000002;
      auVar29._0_8_ = 0x200000002;
      auVar29._16_8_ = 0x200000002;
      auVar29._24_8_ = 0x200000002;
      auVar12 = vpand_avx2(auVar11,auVar29);
      local_16e0._0_8_ = auVar12._0_8_;
      local_16e0._8_8_ = auVar12._8_8_;
      local_16e0._16_8_ = auVar12._16_8_;
      local_16e0._24_8_ = auVar12._24_8_;
      local_aa0 = local_16e0._0_8_;
      uStack_a98 = local_16e0._8_8_;
      uStack_a90 = local_16e0._16_8_;
      uStack_a88 = local_16e0._24_8_;
      local_ac0 = 0;
      uStack_ab8 = 0;
      uStack_ab0 = 0;
      uStack_aa8 = 0;
      local_16e0 = vpcmpeqd_avx2(auVar12,ZEXT1632(ZEXT816(0)));
      local_1580 = local_16c0._0_8_;
      uStack_1578 = local_16c0._8_8_;
      uStack_1570 = local_16c0._16_8_;
      uStack_1568 = local_16c0._24_8_;
      local_1720 = local_16c0._0_8_;
      uStack_1718 = local_16c0._8_8_;
      uStack_1710 = local_16c0._16_8_;
      uStack_1708 = local_16c0._24_8_;
      local_15a0 = local_16e0._0_8_;
      uStack_1598 = local_16e0._8_8_;
      uStack_1590 = local_16e0._16_8_;
      uStack_1588 = local_16e0._24_8_;
      local_1740 = local_16e0._0_8_;
      uStack_1738 = local_16e0._8_8_;
      uStack_1730 = local_16e0._16_8_;
      uStack_1728 = local_16e0._24_8_;
      local_1260 = local_16a0;
      local_1208 = &local_1620;
      local_12b8 = local_15e0;
      local_16a0 = auVar8._0_8_;
      local_1000 = local_16a0;
      uStack_1698 = auVar8._8_8_;
      uStack_ff8 = uStack_1698;
      uStack_1690 = auVar8._16_8_;
      uStack_ff0 = uStack_1690;
      uStack_1688 = auVar8._24_8_;
      uStack_fe8 = uStack_1688;
      local_1020 = 0xbf490000bf490000;
      uStack_1018 = 0xbf490000bf490000;
      uStack_1010 = 0xbf490000bf490000;
      uStack_1008 = 0xbf490000bf490000;
      auVar51._8_4_ = 0xbf490000;
      auVar51._0_8_ = 0xbf490000bf490000;
      auVar51._12_4_ = 0xbf490000;
      auVar51._16_4_ = 0xbf490000;
      auVar51._20_4_ = 0xbf490000;
      auVar51._24_4_ = 0xbf490000;
      auVar51._28_4_ = 0xbf490000;
      local_1040 = local_15e0._0_8_;
      uStack_1038 = local_15e0._8_8_;
      uStack_1030 = local_15e0._16_8_;
      uStack_1028 = local_15e0._24_8_;
      auVar3 = vfmadd213ps_fma(auVar51,auVar8,auVar9);
      local_1220 = &local_1640;
      local_fa0 = local_16a0;
      uStack_f98 = uStack_1698;
      uStack_f90 = uStack_1690;
      uStack_f88 = uStack_1688;
      local_fc0 = 0xb97da000b97da000;
      uStack_fb8 = 0xb97da000b97da000;
      uStack_fb0 = 0xb97da000b97da000;
      uStack_fa8 = 0xb97da000b97da000;
      auVar50._8_4_ = 0xb97da000;
      auVar50._0_8_ = 0xb97da000b97da000;
      auVar50._12_4_ = 0xb97da000;
      auVar50._16_4_ = 0xb97da000;
      auVar50._20_4_ = 0xb97da000;
      auVar50._24_4_ = 0xb97da000;
      auVar50._28_4_ = 0xb97da000;
      local_15e0._0_8_ = auVar3._0_8_;
      local_fe0 = local_15e0._0_8_;
      local_15e0._8_8_ = auVar3._8_8_;
      uStack_fd8 = local_15e0._8_8_;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      auVar3 = vfmadd213ps_fma(auVar50,auVar8,ZEXT1632(auVar3));
      local_1238 = &local_1660;
      local_f40 = local_16a0;
      uStack_f38 = uStack_1698;
      uStack_f30 = uStack_1690;
      uStack_f28 = uStack_1688;
      local_f60 = 0xb3222169b3222169;
      uStack_f58 = 0xb3222169b3222169;
      uStack_f50 = 0xb3222169b3222169;
      uStack_f48 = 0xb3222169b3222169;
      auVar49._8_4_ = 0xb3222169;
      auVar49._0_8_ = 0xb3222169b3222169;
      auVar49._12_4_ = 0xb3222169;
      auVar49._16_4_ = 0xb3222169;
      auVar49._20_4_ = 0xb3222169;
      auVar49._24_4_ = 0xb3222169;
      auVar49._28_4_ = 0xb3222169;
      local_15e0._0_8_ = auVar3._0_8_;
      local_f80 = local_15e0._0_8_;
      local_15e0._8_8_ = auVar3._8_8_;
      uStack_f78 = local_15e0._8_8_;
      uStack_f70 = 0;
      uStack_f68 = 0;
      auVar3 = vfmadd213ps_fma(auVar49,auVar8,ZEXT1632(auVar3));
      auVar108 = ZEXT1632(auVar3);
      local_c20 = 0x200000002;
      uStack_c18 = 0x200000002;
      uStack_c10 = 0x200000002;
      uStack_c08 = 0x200000002;
      local_ba0 = local_c00;
      uStack_b98 = uStack_bf8;
      uStack_b90 = uStack_bf0;
      uStack_b88 = uStack_be8;
      local_bc0 = 0x200000002;
      uStack_bb8 = 0x200000002;
      uStack_bb0 = 0x200000002;
      uStack_ba8 = 0x200000002;
      auVar28._8_8_ = 0x200000002;
      auVar28._0_8_ = 0x200000002;
      auVar28._16_8_ = 0x200000002;
      auVar28._24_8_ = 0x200000002;
      auVar8 = vpsubd_avx2(auVar11,auVar28);
      local_1700._0_8_ = auVar8._0_8_;
      local_1700._8_8_ = auVar8._8_8_;
      local_1700._16_8_ = auVar8._16_8_;
      local_1700._24_8_ = auVar8._24_8_;
      local_960 = local_1700._0_8_;
      uStack_958 = local_1700._8_8_;
      uStack_950 = local_1700._16_8_;
      uStack_948 = local_1700._24_8_;
      local_980 = 0x400000004;
      uStack_978 = 0x400000004;
      uStack_970 = 0x400000004;
      uStack_968 = 0x400000004;
      auVar33._8_8_ = 0x400000004;
      auVar33._0_8_ = 0x400000004;
      auVar33._16_8_ = 0x400000004;
      auVar33._24_8_ = 0x400000004;
      auVar8 = vpandn_avx2(auVar8,auVar33);
      local_1700._0_8_ = auVar8._0_8_;
      local_1700._8_8_ = auVar8._8_8_;
      local_1700._16_8_ = auVar8._16_8_;
      local_1700._24_8_ = auVar8._24_8_;
      local_10a0 = local_1700._0_8_;
      uStack_1098 = local_1700._8_8_;
      uStack_1090 = local_1700._16_8_;
      uStack_1088 = local_1700._24_8_;
      local_10a4 = 0x1d;
      local_c40 = local_1700._0_8_;
      uStack_c38 = local_1700._8_8_;
      uStack_c30 = local_1700._16_8_;
      uStack_c28 = local_1700._24_8_;
      local_c44 = 0x1d;
      local_1700 = vpslld_avx2(auVar8,ZEXT416(0x1d));
      local_15c0 = local_1700._0_8_;
      uStack_15b8 = local_1700._8_8_;
      uStack_15b0 = local_1700._16_8_;
      uStack_15a8 = local_1700._24_8_;
      local_1760 = local_1700._0_8_;
      uStack_1758 = local_1700._8_8_;
      uStack_1750 = local_1700._16_8_;
      uStack_1748 = local_1700._24_8_;
      local_1680 = auVar10._0_8_;
      uStack_1678 = auVar10._8_8_;
      uStack_1670 = auVar10._16_8_;
      uStack_1668 = auVar10._24_8_;
      local_9e0 = local_1680;
      uStack_9d8 = uStack_1678;
      uStack_9d0 = uStack_1670;
      uStack_9c8 = uStack_1668;
      local_a00 = local_16c0._0_8_;
      uStack_9f8 = local_16c0._8_8_;
      uStack_9f0 = local_16c0._16_8_;
      uStack_9e8 = local_16c0._24_8_;
      local_a40 = local_1680 ^ local_16c0._0_8_;
      uStack_a38 = uStack_1678 ^ local_16c0._8_8_;
      uStack_a30 = uStack_1670 ^ local_16c0._16_8_;
      uStack_a28 = uStack_1668 ^ local_16c0._24_8_;
      uStack_1678 = uStack_a38;
      local_1680 = local_a40;
      uStack_1670 = uStack_a30;
      uStack_1668 = uStack_a28;
      local_15e0._0_8_ = auVar3._0_8_;
      local_15e0._8_8_ = auVar3._8_8_;
      local_1320 = local_15e0._0_8_;
      uVar67 = local_1320;
      uStack_1318 = local_15e0._8_8_;
      uVar68 = uStack_1318;
      uStack_1310 = 0;
      uStack_1308 = 0;
      local_1340 = local_15e0._0_8_;
      uStack_1338 = local_15e0._8_8_;
      uStack_1330 = 0;
      uStack_1328 = 0;
      local_1320._0_4_ = auVar3._0_4_;
      local_1320._4_4_ = auVar3._4_4_;
      uStack_1318._0_4_ = auVar3._8_4_;
      uStack_1318._4_4_ = auVar3._12_4_;
      local_1780 = (float)local_1320 * (float)local_1320;
      fStack_177c = local_1320._4_4_ * local_1320._4_4_;
      fStack_1778 = (float)uStack_1318 * (float)uStack_1318;
      fStack_1774 = uStack_1318._4_4_ * uStack_1318._4_4_;
      uStack_1770 = 0;
      uStack_176c = 0;
      uStack_1768 = 0;
      uStack_1764 = 0;
      uStack_1698._0_4_ = 0x37ccf5ce;
      local_16a0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_1698._4_4_ = 0x37ccf5ce;
      uStack_1690._0_4_ = 0x37ccf5ce;
      uStack_1690._4_4_ = 0x37ccf5ce;
      auVar61 = _local_16a0;
      uStack_1688._0_4_ = 0x37ccf5ce;
      uStack_1688._4_4_ = 0x37ccf5ce;
      auVar8 = _local_16a0;
      local_1298 = &local_1780;
      local_1258 = _ps256_coscof_p1;
      local_ee0 = 0x37ccf5ce37ccf5ce;
      uStack_ed8 = uStack_1698;
      uStack_1690 = auVar61._16_8_;
      uStack_ed0 = uStack_1690;
      uStack_1688 = auVar8._24_8_;
      uStack_ec8 = uStack_1688;
      local_f00 = CONCAT44(fStack_177c,local_1780);
      uStack_ef8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      local_f20[0] = -0.0013887316;
      local_f20[1] = -0.0013887316;
      afStack_f18[0] = -0.0013887316;
      afStack_f18[1] = -0.0013887316;
      afStack_f10[0] = -0.0013887316;
      afStack_f10[1] = -0.0013887316;
      afStack_f08[0] = -0.0013887316;
      afStack_f08[1] = -0.0013887316;
      auVar22._8_4_ = -0.0013887316;
      auVar22._12_4_ = -0.0013887316;
      auVar22._0_4_ = -0.0013887316;
      auVar22._4_4_ = -0.0013887316;
      auVar22._16_4_ = -0.0013887316;
      auVar22._20_4_ = -0.0013887316;
      auVar22._24_4_ = -0.0013887316;
      auVar22._28_4_ = -0.0013887316;
      auVar3 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               auVar8,auVar22);
      local_1270 = _ps256_coscof_p2;
      local_16a0 = auVar3._0_8_;
      local_e80 = local_16a0;
      uStack_1698 = auVar3._8_8_;
      uStack_e78 = uStack_1698;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = CONCAT44(fStack_177c,local_1780);
      uStack_e98 = CONCAT44(fStack_1774,fStack_1778);
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_ec0[0] = 0.041666646;
      local_ec0[1] = 0.041666646;
      afStack_eb8[0] = 0.041666646;
      afStack_eb8[1] = 0.041666646;
      afStack_eb0[0] = 0.041666646;
      afStack_eb0[1] = 0.041666646;
      afStack_ea8[0] = 0.041666646;
      afStack_ea8[1] = 0.041666646;
      auVar23._8_4_ = 0.041666646;
      auVar23._12_4_ = 0.041666646;
      auVar23._0_4_ = 0.041666646;
      auVar23._4_4_ = 0.041666646;
      auVar23._16_4_ = 0.041666646;
      auVar23._20_4_ = 0.041666646;
      auVar23._24_4_ = 0.041666646;
      auVar23._28_4_ = 0.041666646;
      auVar3 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               ZEXT1632(auVar3),auVar23);
      local_16a0 = auVar3._0_8_;
      uStack_1698 = auVar3._8_8_;
      local_1380 = CONCAT44(fStack_177c,local_1780);
      uStack_1378 = CONCAT44(fStack_1774,fStack_1778);
      uStack_1370 = 0;
      uStack_1368 = 0;
      local_1360 = local_16a0;
      uVar65 = local_1360;
      uStack_1358 = uStack_1698;
      uVar66 = uStack_1358;
      uStack_1350 = 0;
      uStack_1348 = 0;
      local_1360._0_4_ = auVar3._0_4_;
      local_1360._4_4_ = auVar3._4_4_;
      uStack_1358._0_4_ = auVar3._8_4_;
      uStack_1358._4_4_ = auVar3._12_4_;
      local_16a0._4_4_ = local_1360._4_4_ * fStack_177c;
      local_16a0._0_4_ = (float)local_1360 * local_1780;
      uStack_1698._0_4_ = (float)uStack_1358 * fStack_1778;
      uStack_1698._4_4_ = uStack_1358._4_4_ * fStack_1774;
      local_13c0 = CONCAT44(fStack_177c,local_1780);
      uStack_13b8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_13b0 = 0;
      uStack_13a8 = 0;
      local_13a0 = local_16a0;
      uStack_1398 = uStack_1698;
      uStack_1390 = 0;
      uStack_1388 = 0;
      local_16a0._4_4_ = local_1360._4_4_ * fStack_177c * fStack_177c;
      local_16a0._0_4_ = (float)local_1360 * local_1780 * local_1780;
      local_d40 = local_16a0;
      uStack_1698._0_4_ = (float)uStack_1358 * fStack_1778 * fStack_1778;
      uStack_1698._4_4_ = uStack_1358._4_4_ * fStack_1774 * fStack_1774;
      auVar3 = _local_16a0;
      _local_16a0 = ZEXT1632(_local_16a0);
      auVar8 = _local_16a0;
      local_11f0 = ::_ps256_0p5;
      local_d00 = CONCAT44(fStack_177c,local_1780);
      uStack_cf8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20[0] = 0.5;
      local_d20[1] = 0.5;
      afStack_d18[0] = 0.5;
      afStack_d18[1] = 0.5;
      afStack_d10[0] = 0.5;
      afStack_d10[1] = 0.5;
      afStack_d08[0] = 0.5;
      afStack_d08[1] = 0.5;
      uStack_1698 = auVar3._8_8_;
      uStack_d38 = uStack_1698;
      uStack_d30 = 0;
      uStack_d28 = 0;
      auVar26._8_4_ = 0.5;
      auVar26._12_4_ = 0.5;
      auVar26._0_4_ = 0.5;
      auVar26._4_4_ = 0.5;
      auVar26._16_4_ = 0.5;
      auVar26._20_4_ = 0.5;
      auVar26._24_4_ = 0.5;
      auVar26._28_4_ = 0.5;
      auVar3 = vfnmadd213ps_fma(auVar26,ZEXT1632(CONCAT412(fStack_1774,
                                                           CONCAT48(fStack_1778,
                                                                    CONCAT44(fStack_177c,local_1780)
                                                                   ))),auVar8);
      local_16a0 = auVar3._0_8_;
      uStack_1698 = auVar3._8_8_;
      local_1140 = local_16a0;
      uVar89 = local_1140;
      uStack_1138 = uStack_1698;
      uVar90 = uStack_1138;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1160 = 0x3f800000;
      uStack_115c = 0x3f800000;
      uStack_1158 = 0x3f800000;
      uStack_1154 = 0x3f800000;
      uStack_1150 = 0x3f800000;
      uStack_114c = 0x3f800000;
      uStack_1148 = 0x3f800000;
      uStack_1144 = 0x3f800000;
      local_1140._0_4_ = auVar3._0_4_;
      local_1140._4_4_ = auVar3._4_4_;
      uStack_1138._0_4_ = auVar3._8_4_;
      uStack_1138._4_4_ = auVar3._12_4_;
      local_16a0._4_4_ = local_1140._4_4_ + 1.0;
      local_16a0._0_4_ = (float)local_1140 + 1.0;
      uStack_1698._0_4_ = (float)uStack_1138 + 1.0;
      uStack_1698._4_4_ = uStack_1138._4_4_ + 1.0;
      uStack_1690._0_4_ = 0x3f800000;
      uStack_1690._4_4_ = 0x3f800000;
      auVar62 = _local_16a0;
      uStack_1688._0_4_ = 0x3f800000;
      uStack_1688._4_4_ = 0x3f800000;
      auVar9 = _local_16a0;
      uStack_1798._0_4_ = 0xb94ca1f9;
      local_17a0 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_1798._4_4_ = 0xb94ca1f9;
      uStack_1790._0_4_ = 0xb94ca1f9;
      uStack_1790._4_4_ = 0xb94ca1f9;
      auVar61 = _local_17a0;
      uStack_1788._0_4_ = 0xb94ca1f9;
      uStack_1788._4_4_ = 0xb94ca1f9;
      auVar8 = _local_17a0;
      local_12a8 = local_17a0;
      local_1288 = _ps256_sincof_p1;
      local_e20 = 0xb94ca1f9b94ca1f9;
      uStack_e18 = uStack_1798;
      uStack_1790 = auVar61._16_8_;
      uStack_e10 = uStack_1790;
      uStack_1788 = auVar8._24_8_;
      uStack_e08 = uStack_1788;
      local_e40 = CONCAT44(fStack_177c,local_1780);
      uStack_e38 = CONCAT44(fStack_1774,fStack_1778);
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60[0] = 0.008332161;
      local_e60[1] = 0.008332161;
      afStack_e58[0] = 0.008332161;
      afStack_e58[1] = 0.008332161;
      afStack_e50[0] = 0.008332161;
      afStack_e50[1] = 0.008332161;
      afStack_e48[0] = 0.008332161;
      afStack_e48[1] = 0.008332161;
      auVar24._8_4_ = 0.008332161;
      auVar24._12_4_ = 0.008332161;
      auVar24._0_4_ = 0.008332161;
      auVar24._4_4_ = 0.008332161;
      auVar24._16_4_ = 0.008332161;
      auVar24._20_4_ = 0.008332161;
      auVar24._24_4_ = 0.008332161;
      auVar24._28_4_ = 0.008332161;
      auVar3 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               auVar8,auVar24);
      local_12a0 = _ps256_sincof_p2;
      local_17a0 = auVar3._0_8_;
      local_dc0 = local_17a0;
      uStack_1798 = auVar3._8_8_;
      uStack_db8 = uStack_1798;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = CONCAT44(fStack_177c,local_1780);
      uStack_dd8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_e00[0] = -0.16666655;
      local_e00[1] = -0.16666655;
      afStack_df8[0] = -0.16666655;
      afStack_df8[1] = -0.16666655;
      afStack_df0[0] = -0.16666655;
      afStack_df0[1] = -0.16666655;
      afStack_de8[0] = -0.16666655;
      afStack_de8[1] = -0.16666655;
      auVar25._8_4_ = -0.16666655;
      auVar25._12_4_ = -0.16666655;
      auVar25._0_4_ = -0.16666655;
      auVar25._4_4_ = -0.16666655;
      auVar25._16_4_ = -0.16666655;
      auVar25._20_4_ = -0.16666655;
      auVar25._24_4_ = -0.16666655;
      auVar25._28_4_ = -0.16666655;
      auVar3 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               ZEXT1632(auVar3),auVar25);
      local_17a0 = auVar3._0_8_;
      uStack_1798 = auVar3._8_8_;
      local_1400 = CONCAT44(fStack_177c,local_1780);
      uStack_13f8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_13f0 = 0;
      uStack_13e8 = 0;
      local_13e0 = local_17a0;
      uVar63 = local_13e0;
      uStack_13d8 = uStack_1798;
      uVar64 = uStack_13d8;
      uStack_13d0 = 0;
      uStack_13c8 = 0;
      local_13e0._0_4_ = auVar3._0_4_;
      local_13e0._4_4_ = auVar3._4_4_;
      uStack_13d8._0_4_ = auVar3._8_4_;
      uStack_13d8._4_4_ = auVar3._12_4_;
      local_17a0._4_4_ = local_13e0._4_4_ * fStack_177c;
      local_17a0._0_4_ = (float)local_13e0 * local_1780;
      local_d60 = local_17a0;
      uStack_1798._0_4_ = (float)uStack_13d8 * fStack_1778;
      uStack_1798._4_4_ = uStack_13d8._4_4_ * fStack_1774;
      auVar3 = _local_17a0;
      _local_17a0 = ZEXT1632(_local_17a0);
      auVar8 = _local_17a0;
      uStack_1798 = auVar3._8_8_;
      uStack_d58 = uStack_1798;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = local_15e0._0_8_;
      uStack_d78 = local_15e0._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = local_15e0._0_8_;
      uStack_d98 = local_15e0._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      auVar3 = vfmadd213ps_fma(auVar108,auVar8,auVar108);
      local_1660._4_4_ = local_16e0._4_4_;
      uStack_1658._4_4_ = local_16e0._12_4_;
      uStack_1650._4_4_ = local_16e0._20_4_;
      uStack_1648._4_4_ = local_16e0._28_4_;
      local_17a0 = auVar3._0_8_;
      uStack_1798 = auVar3._8_8_;
      local_1540 = local_16e0._0_8_;
      uStack_1538 = local_16e0._8_8_;
      uStack_1530 = local_16e0._16_8_;
      uStack_1528 = local_16e0._24_8_;
      local_1560 = local_17a0;
      uStack_1558 = uStack_1798;
      uStack_1550 = 0;
      uStack_1548 = 0;
      local_17c0 = vpand_avx2(local_16e0,ZEXT1632(auVar3));
      uStack_1690 = auVar62._16_8_;
      uStack_1688 = auVar9._24_8_;
      local_9a0 = local_16e0._0_8_;
      uStack_998 = local_16e0._8_8_;
      uStack_990 = local_16e0._16_8_;
      uStack_988 = local_16e0._24_8_;
      local_9c0 = local_16a0;
      uStack_9b8 = uStack_1698;
      uStack_9b0 = uStack_1690;
      uStack_9a8 = uStack_1688;
      auVar32._16_8_ = uStack_1690;
      auVar32._0_16_ = _local_16a0;
      auVar32._24_8_ = uStack_1688;
      local_17e0 = vpandn_avx2(local_16e0,auVar32);
      local_1440 = local_17a0;
      uStack_1438 = uStack_1798;
      uStack_1430 = 0;
      uStack_1428 = 0;
      local_1460 = local_17c0._0_8_;
      uStack_1458 = local_17c0._8_8_;
      uStack_1450 = local_17c0._16_8_;
      uStack_1448 = local_17c0._24_8_;
      _local_17a0 = vsubps_avx(ZEXT1632(auVar3),local_17c0);
      local_1480 = local_16a0;
      uStack_1478 = uStack_1698;
      uStack_1470 = uStack_1690;
      uStack_1468 = uStack_1688;
      local_14a0 = local_17e0._0_8_;
      uStack_1498 = local_17e0._8_8_;
      uStack_1490 = local_17e0._16_8_;
      uStack_1488 = local_17e0._24_8_;
      auVar12._16_8_ = uStack_1690;
      auVar12._0_16_ = _local_16a0;
      auVar12._24_8_ = uStack_1688;
      _local_16a0 = vsubps_avx(auVar12,local_17e0);
      local_1180 = local_17e0._0_8_;
      uVar85 = local_1180;
      uStack_1178 = local_17e0._8_8_;
      uVar86 = uStack_1178;
      uStack_1170 = local_17e0._16_8_;
      uVar87 = uStack_1170;
      uStack_1168 = local_17e0._24_8_;
      uVar88 = uStack_1168;
      local_11a0 = local_17c0._0_8_;
      uVar81 = local_11a0;
      uStack_1198 = local_17c0._8_8_;
      uVar82 = uStack_1198;
      uStack_1190 = local_17c0._16_8_;
      uVar83 = uStack_1190;
      uStack_1188 = local_17c0._24_8_;
      uVar84 = uStack_1188;
      local_1180._0_4_ = local_17e0._0_4_;
      local_1180._4_4_ = local_17e0._4_4_;
      uStack_1178._0_4_ = local_17e0._8_4_;
      uStack_1178._4_4_ = local_17e0._12_4_;
      uStack_1170._0_4_ = local_17e0._16_4_;
      uStack_1170._4_4_ = local_17e0._20_4_;
      uStack_1168._0_4_ = local_17e0._24_4_;
      uStack_1168._4_4_ = local_17e0._28_4_;
      local_11a0._0_4_ = local_17c0._0_4_;
      local_11a0._4_4_ = local_17c0._4_4_;
      uStack_1198._0_4_ = local_17c0._8_4_;
      uStack_1198._4_4_ = local_17c0._12_4_;
      uStack_1190._0_4_ = local_17c0._16_4_;
      uStack_1190._4_4_ = local_17c0._20_4_;
      uStack_1188._0_4_ = local_17c0._24_4_;
      uStack_1188._4_4_ = local_17c0._28_4_;
      local_1620 = (float)local_1180 + (float)local_11a0;
      fStack_161c = local_1180._4_4_ + local_11a0._4_4_;
      fStack_1618 = (float)uStack_1178 + (float)uStack_1198;
      fStack_1614 = uStack_1178._4_4_ + uStack_1198._4_4_;
      fStack_1610 = (float)uStack_1170 + (float)uStack_1190;
      fStack_160c = uStack_1170._4_4_ + uStack_1190._4_4_;
      fStack_1608 = (float)uStack_1168 + (float)uStack_1188;
      fStack_1604 = uStack_1168._4_4_ + uStack_1188._4_4_;
      local_11c0 = local_16a0;
      uVar77 = local_11c0;
      uStack_11b8 = uStack_1698;
      uVar78 = uStack_11b8;
      uStack_11b0 = uStack_1690;
      uVar79 = uStack_11b0;
      uStack_11a8 = uStack_1688;
      uVar80 = uStack_11a8;
      local_11e0 = local_17a0;
      uVar73 = local_11e0;
      uStack_11d8 = uStack_1798;
      uVar74 = uStack_11d8;
      uStack_11d0 = uStack_1790;
      uVar75 = uStack_11d0;
      uStack_11c8 = uStack_1788;
      uVar76 = uStack_11c8;
      local_11c0._0_4_ = local_16a0._0_4_;
      local_11c0._4_4_ = local_16a0._4_4_;
      uStack_11b8._0_4_ = local_16a0._8_4_;
      uStack_11b8._4_4_ = local_16a0._12_4_;
      uStack_11b0._0_4_ = local_16a0._16_4_;
      uStack_11b0._4_4_ = local_16a0._20_4_;
      uStack_11a8._0_4_ = local_16a0._24_4_;
      uStack_11a8._4_4_ = local_16a0._28_4_;
      local_11e0._0_4_ = local_17a0._0_4_;
      local_11e0._4_4_ = local_17a0._4_4_;
      uStack_11d8._0_4_ = local_17a0._8_4_;
      uStack_11d8._4_4_ = local_17a0._12_4_;
      uStack_11d0._0_4_ = local_17a0._16_4_;
      uStack_11d0._4_4_ = local_17a0._20_4_;
      uStack_11c8._0_4_ = local_17a0._24_4_;
      uStack_11c8._4_4_ = local_17a0._28_4_;
      local_1640 = (float)local_11c0 + (float)local_11e0;
      fStack_163c = local_11c0._4_4_ + local_11e0._4_4_;
      fStack_1638 = (float)uStack_11b8 + (float)uStack_11d8;
      fStack_1634 = uStack_11b8._4_4_ + uStack_11d8._4_4_;
      fStack_1630 = (float)uStack_11b0 + (float)uStack_11d0;
      fStack_162c = uStack_11b0._4_4_ + uStack_11d0._4_4_;
      fStack_1628 = (float)uStack_11a8 + (float)uStack_11c8;
      fStack_1624 = uStack_11a8._4_4_ + uStack_11c8._4_4_;
      local_a20 = CONCAT44(fStack_161c,local_1620);
      uStack_a18 = CONCAT44(fStack_1614,fStack_1618);
      uStack_a10 = CONCAT44(fStack_160c,fStack_1610);
      uStack_a08 = CONCAT44(fStack_1604,fStack_1608);
      local_18e0._0_8_ = local_a20 ^ local_a40;
      local_18e0._8_8_ = uStack_a18 ^ uStack_a38;
      local_18e0._16_8_ = uStack_a10 ^ uStack_a30;
      local_18e0._24_8_ = uStack_a08 ^ uStack_a28;
      local_a60 = CONCAT44(fStack_163c,local_1640);
      uStack_a58 = CONCAT44(fStack_1634,fStack_1638);
      uStack_a50 = CONCAT44(fStack_162c,fStack_1630);
      uStack_a48 = CONCAT44(fStack_1624,fStack_1628);
      local_a80 = local_1700._0_8_;
      uStack_a78 = local_1700._8_8_;
      uStack_a70 = local_1700._16_8_;
      uStack_a68 = local_1700._24_8_;
      auVar8._8_8_ = uStack_a58;
      auVar8._0_8_ = local_a60;
      auVar8._16_8_ = uStack_a50;
      auVar8._24_8_ = uStack_a48;
      auVar8 = auVar8 ^ local_1700;
      fStack_18e4 = auVar8._28_4_;
      fStack_18e8 = auVar8._24_4_;
      fStack_18ec = auVar8._20_4_;
      fStack_18f0 = auVar8._16_4_;
      fStack_18f4 = auVar8._12_4_;
      fStack_18f8 = auVar8._8_4_;
      fStack_18fc = auVar8._4_4_;
      local_1900 = auVar8._0_4_;
      local_1820 = auVar8._0_8_;
      local_1860 = 0;
      uStack_1858 = 0;
      uStack_1850 = 0;
      uStack_1848 = 0;
      uVar13 = vcmpps_avx512vl(auVar8,ZEXT1632(ZEXT816(0)),0);
      local_1940 = vpmovm2d_avx512vl(uVar13);
      local_1880 = local_900._0_8_;
      uStack_1878 = local_900._8_8_;
      uStack_1870 = auStack_8f0._0_8_;
      uStack_1868 = auStack_8f0._8_8_;
      local_18a0 = local_1940._0_8_;
      uStack_1898 = local_1940._8_8_;
      uStack_1890 = local_1940._16_8_;
      uStack_1888 = local_1940._24_8_;
      auVar9._16_8_ = auStack_8f0._0_8_;
      auVar9._0_16_ = local_900;
      auVar9._24_8_ = auStack_8f0._8_8_;
      local_1960 = vpand_avx2(auVar9,local_1940);
      uStack_1818 = auVar8._8_8_;
      uStack_1810 = auVar8._16_8_;
      uStack_1808 = auVar8._24_8_;
      local_1840._0_4_ = local_1960._0_4_;
      local_1840._4_4_ = local_1960._4_4_;
      uStack_1838._0_4_ = local_1960._8_4_;
      uStack_1838._4_4_ = local_1960._12_4_;
      uStack_1830._0_4_ = local_1960._16_4_;
      uStack_1830._4_4_ = local_1960._20_4_;
      uStack_1828._0_4_ = local_1960._24_4_;
      uStack_1828._4_4_ = local_1960._28_4_;
      local_1900 = local_1900 + (float)local_1840;
      fStack_18fc = fStack_18fc + local_1840._4_4_;
      fStack_18f8 = fStack_18f8 + (float)uStack_1838;
      fStack_18f4 = fStack_18f4 + uStack_1838._4_4_;
      fStack_18f0 = fStack_18f0 + (float)uStack_1830;
      fStack_18ec = fStack_18ec + uStack_1830._4_4_;
      fStack_18e8 = fStack_18e8 + (float)uStack_1828;
      fStack_18e4 = fStack_18e4 + uStack_1828._4_4_;
      local_940 = CONCAT44(fStack_18fc,local_1900);
      uStack_938 = CONCAT44(fStack_18f4,fStack_18f8);
      uStack_930 = CONCAT44(fStack_18ec,fStack_18f0);
      uStack_928 = CONCAT44(fStack_18e4,fStack_18e8);
      auVar34._8_8_ = uStack_938;
      auVar34._0_8_ = local_940;
      auVar34._16_8_ = uStack_930;
      auVar34._24_8_ = uStack_928;
      local_1980 = vdivps_avx(local_18e0,auVar34);
      local_3aa0 = local_1980._0_8_;
      uStack_3a98 = local_1980._8_8_;
      uStack_3a90 = local_1980._16_8_;
      uStack_3a88 = local_1980._24_8_;
      local_38e0 = local_39f0;
      local_3900 = local_1980._0_8_;
      uStack_38f8 = local_1980._8_8_;
      uStack_38f0 = local_1980._16_8_;
      uStack_38e8 = local_1980._24_8_;
      *(undefined1 (*) [32])*local_39f0 = local_1980;
      local_39f0 = (undefined1 (*) [64])(*local_39f0 + 0x20);
      local_1840 = local_1960._0_8_;
      uStack_1838 = local_1960._8_8_;
      uStack_1830 = local_1960._16_8_;
      uStack_1828 = local_1960._24_8_;
      uVar13 = local_16e0._0_8_;
      uVar91 = local_16e0._8_8_;
      uVar92 = local_16e0._16_8_;
      uVar93 = local_16e0._24_8_;
      local_15e0 = auVar108;
      uStack_14f0 = uStack_18b0;
      uStack_14e8 = uStack_18a8;
      uStack_14b0 = uStack_18b0;
      uStack_14a8 = uStack_18a8;
      local_13e0 = uVar63;
      uStack_13d8 = uVar64;
      local_1360 = uVar65;
      uStack_1358 = uVar66;
      local_1320 = uVar67;
      uStack_1318 = uVar68;
      local_12e0 = uVar69;
      uStack_12d8 = uVar70;
      uStack_12d0 = uVar71;
      uStack_12c8 = uVar72;
      local_12b0 = local_12b8;
      local_1290 = local_12a8;
      local_1280 = local_1298;
      local_1278 = local_12a8;
      local_1268 = local_1298;
      local_1250 = local_1298;
      local_1248 = local_1260;
      local_1240 = local_12b8;
      local_1230 = local_1260;
      local_1228 = local_12b8;
      local_1218 = local_1260;
      local_1210 = local_12b8;
      local_1200 = local_1260;
      local_11f8 = local_1260;
      local_11e8 = local_1298;
      local_11e0 = uVar73;
      uStack_11d8 = uVar74;
      uStack_11d0 = uVar75;
      uStack_11c8 = uVar76;
      local_11c0 = uVar77;
      uStack_11b8 = uVar78;
      uStack_11b0 = uVar79;
      uStack_11a8 = uVar80;
      local_11a0 = uVar81;
      uStack_1198 = uVar82;
      uStack_1190 = uVar83;
      uStack_1188 = uVar84;
      local_1180 = uVar85;
      uStack_1178 = uVar86;
      uStack_1170 = uVar87;
      uStack_1168 = uVar88;
      local_1140 = uVar89;
      uStack_1138 = uVar90;
    }
    for (; uStack_718 = uVar91, local_720 = uVar13, uVar99 = uStack_718._4_4_,
        uVar98 = local_720._4_4_, local_3868 = local_3990, local_3a18 = local_38b8,
        local_3a3c + 3 < local_39e4; local_3a3c = local_3a3c + 4) {
      local_38d8 = local_39f0;
      local_860 = *(undefined8 *)*local_39f0;
      uStack_858 = *(undefined8 *)(*local_39f0 + 8);
      local_3818 = local_39c9;
      local_3820 = &local_3ab0;
      local_7e4 = 0x322bcc77;
      local_800 = 0x322bcc77;
      uStack_7fc = 0x322bcc77;
      uStack_7f8 = 0x322bcc77;
      uStack_7f4 = 0x322bcc77;
      local_890 = 0x322bcc77322bcc77;
      uStack_888 = 0x322bcc77322bcc77;
      local_6e8 = local_870;
      local_6f0 = &local_880;
      local_600 = (undefined1  [16])0x0;
      local_660 = 0x7fffffff;
      uStack_65c = 0x7fffffff;
      uStack_658 = 0x7fffffff;
      uStack_654 = 0x7fffffff;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_39f0,auVar6);
      local_680 = 0x80000000;
      uStack_67c = 0x80000000;
      uStack_678 = 0x80000000;
      uStack_674 = 0x80000000;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar5 = vpand_avx(*(undefined1 (*) [16])*local_39f0,auVar5);
      local_6e0._0_8_ = auVar4._0_8_;
      local_6e0._8_8_ = auVar4._8_8_;
      local_560 = local_6e0._0_8_;
      uVar67 = local_560;
      uStack_558 = local_6e0._8_8_;
      uVar68 = uStack_558;
      local_570 = 0x3fa2f983;
      uStack_56c = 0x3fa2f983;
      uStack_568 = 0x3fa2f983;
      uStack_564 = 0x3fa2f983;
      local_560._0_4_ = auVar4._0_4_;
      local_560._4_4_ = auVar4._4_4_;
      uStack_558._0_4_ = auVar4._8_4_;
      uStack_558._4_4_ = auVar4._12_4_;
      local_740._4_4_ = local_560._4_4_ * 1.2732395;
      local_740._0_4_ = (float)local_560 * 1.2732395;
      uStack_738._0_4_ = (float)uStack_558 * 1.2732395;
      uStack_738._4_4_ = uStack_558._4_4_ * 1.2732395;
      local_4f0 = local_740;
      uStack_4e8 = uStack_738;
      local_760._4_4_ = (int)(local_560._4_4_ * 1.2732395);
      local_760._0_4_ = (int)((float)local_560 * 1.2732395);
      local_760._8_4_ = (int)((float)uStack_558 * 1.2732395);
      local_760._12_4_ = (int)(uStack_558._4_4_ * 1.2732395);
      local_3e0 = local_760._0_8_;
      uStack_3d8 = local_760._8_8_;
      local_3f0 = 0x100000001;
      uStack_3e8 = 0x100000001;
      auVar36._8_8_ = local_760._8_8_;
      auVar36._0_8_ = local_760._0_8_;
      auVar35._8_8_ = 0x100000001;
      auVar35._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar36,auVar35);
      local_760._0_8_ = auVar3._0_8_;
      local_760._8_8_ = auVar3._8_8_;
      local_170 = local_760._0_8_;
      uStack_168 = local_760._8_8_;
      local_180 = 0xfffffffefffffffe;
      uStack_178 = 0xfffffffefffffffe;
      auVar45._8_8_ = 0xfffffffefffffffe;
      auVar45._0_8_ = 0xfffffffefffffffe;
      auVar6 = vpand_avx(auVar3,auVar45);
      local_760._0_8_ = auVar6._0_8_;
      local_1d0 = local_760._0_8_;
      local_760._8_8_ = auVar6._8_8_;
      uStack_1c8 = local_760._8_8_;
      local_4e0 = local_760._0_8_;
      uStack_4d8 = local_760._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar6);
      local_190 = local_760._0_8_;
      uStack_188 = local_760._8_8_;
      local_1a0 = 0x400000004;
      uStack_198 = 0x400000004;
      auVar44._8_8_ = 0x400000004;
      auVar44._0_8_ = 0x400000004;
      auVar7 = vpand_avx(auVar6,auVar44);
      local_750._0_8_ = auVar7._0_8_;
      local_750._8_8_ = auVar7._8_8_;
      local_3a0 = local_750._0_8_;
      uStack_398 = local_750._8_8_;
      local_3a4 = 0x1d;
      local_750 = vpslld_avx(auVar7,ZEXT416(0x1d));
      local_6b0 = local_750._0_8_;
      uStack_6a8 = local_750._8_8_;
      local_780 = local_750._0_8_;
      uStack_778 = local_750._8_8_;
      local_1b0 = local_760._0_8_;
      uStack_1a8 = local_760._8_8_;
      local_1c0 = 0x200000002;
      uStack_1b8 = 0x200000002;
      auVar43._8_8_ = 0x200000002;
      auVar43._0_8_ = 0x200000002;
      auVar7 = vpand_avx(auVar6,auVar43);
      local_760._0_8_ = auVar7._0_8_;
      local_760._8_8_ = auVar7._8_8_;
      local_140 = (undefined1  [16])0x0;
      local_150 = local_760._0_8_;
      uStack_148 = local_760._8_8_;
      local_160 = 0;
      uStack_158 = 0;
      local_760 = vpcmpeqd_avx(auVar7,ZEXT816(0));
      local_6c0 = local_760._0_8_;
      uStack_6b8 = local_760._8_8_;
      local_790 = local_760._0_8_;
      uStack_788 = local_760._8_8_;
      local_4c8 = local_740;
      local_400 = &local_700;
      local_4b0 = local_6e0;
      local_740 = auVar3._0_8_;
      local_340 = local_740;
      uStack_738 = auVar3._8_8_;
      uStack_338 = uStack_738;
      local_350 = 0xbf490000bf490000;
      uStack_348 = 0xbf490000bf490000;
      auVar59._8_4_ = 0xbf490000;
      auVar59._0_8_ = 0xbf490000bf490000;
      auVar59._12_4_ = 0xbf490000;
      local_360 = local_6e0._0_8_;
      uStack_358 = local_6e0._8_8_;
      auVar4 = vfmadd213ps_fma(auVar59,auVar3,auVar4);
      local_418 = &local_710;
      local_310 = local_740;
      uStack_308 = uStack_738;
      local_320 = 0xb97da000b97da000;
      uStack_318 = 0xb97da000b97da000;
      auVar58._8_4_ = 0xb97da000;
      auVar58._0_8_ = 0xb97da000b97da000;
      auVar58._12_4_ = 0xb97da000;
      local_6e0._0_8_ = auVar4._0_8_;
      local_330 = local_6e0._0_8_;
      local_6e0._8_8_ = auVar4._8_8_;
      uStack_328 = local_6e0._8_8_;
      auVar4 = vfmadd213ps_fma(auVar58,auVar3,auVar4);
      local_430 = &local_720;
      local_2e0 = local_740;
      uStack_2d8 = uStack_738;
      local_2f0 = 0xb3222169b3222169;
      uStack_2e8 = 0xb3222169b3222169;
      auVar57._8_4_ = 0xb3222169;
      auVar57._0_8_ = 0xb3222169b3222169;
      auVar57._12_4_ = 0xb3222169;
      local_6e0._0_8_ = auVar4._0_8_;
      local_300 = local_6e0._0_8_;
      local_6e0._8_8_ = auVar4._8_8_;
      uStack_2f8 = local_6e0._8_8_;
      local_6e0 = vfmadd213ps_fma(auVar57,auVar3,auVar4);
      local_1e0 = 0x200000002;
      uStack_1d8 = 0x200000002;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar3 = vpsubd_avx(auVar6,auVar42);
      local_770._0_8_ = auVar3._0_8_;
      local_770._8_8_ = auVar3._8_8_;
      local_a0 = local_770._0_8_;
      uStack_98 = local_770._8_8_;
      local_b0 = 0x400000004;
      uStack_a8 = 0x400000004;
      auVar47._8_8_ = 0x400000004;
      auVar47._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar3,auVar47);
      local_770._0_8_ = auVar3._0_8_;
      local_770._8_8_ = auVar3._8_8_;
      local_3c0 = local_770._0_8_;
      uStack_3b8 = local_770._8_8_;
      local_3c4 = 0x1d;
      local_770 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_6d0 = local_770._0_8_;
      uStack_6c8 = local_770._8_8_;
      local_7a0 = local_770._0_8_;
      uStack_798 = local_770._8_8_;
      local_730 = auVar5._0_8_;
      uStack_728 = auVar5._8_8_;
      local_e0 = local_730;
      uStack_d8 = uStack_728;
      local_f0 = local_750._0_8_;
      uStack_e8 = local_750._8_8_;
      local_110 = local_730 ^ local_750._0_8_;
      uStack_108 = uStack_728 ^ local_750._8_8_;
      uStack_728 = uStack_108;
      local_730 = local_110;
      local_580 = local_6e0._0_8_;
      uVar65 = local_580;
      uStack_578 = local_6e0._8_8_;
      uVar66 = uStack_578;
      local_590 = local_6e0._0_8_;
      uStack_588 = local_6e0._8_8_;
      local_580._0_4_ = local_6e0._0_4_;
      local_580._4_4_ = local_6e0._4_4_;
      uStack_578._0_4_ = local_6e0._8_4_;
      uStack_578._4_4_ = local_6e0._12_4_;
      local_7b0 = (float)local_580 * (float)local_580;
      fStack_7ac = local_580._4_4_ * local_580._4_4_;
      fStack_7a8 = (float)uStack_578 * (float)uStack_578;
      fStack_7a4 = uStack_578._4_4_ * uStack_578._4_4_;
      uStack_738._0_4_ = 0x37ccf5ce;
      local_740 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_738._4_4_ = 0x37ccf5ce;
      local_4b8 = &local_7b0;
      local_450 = _ps_coscof_p1;
      local_2b0 = 0x37ccf5ce37ccf5ce;
      uStack_2a8 = uStack_738;
      local_2c0 = CONCAT44(fStack_7ac,local_7b0);
      uStack_2b8 = CONCAT44(fStack_7a4,fStack_7a8);
      auVar52._4_4_ = fStack_7ac;
      auVar52._0_4_ = local_7b0;
      auVar52._8_4_ = fStack_7a8;
      auVar52._12_4_ = fStack_7a4;
      local_2d0[0] = -0.0013887316;
      local_2d0[1] = -0.0013887316;
      afStack_2c8[0] = -0.0013887316;
      afStack_2c8[1] = -0.0013887316;
      auVar38._8_4_ = -0.0013887316;
      auVar38._12_4_ = -0.0013887316;
      auVar38._0_4_ = -0.0013887316;
      auVar38._4_4_ = -0.0013887316;
      auVar3 = vfmadd213ps_fma(auVar52,_local_740,auVar38);
      local_468 = _ps_coscof_p2;
      local_740 = auVar3._0_8_;
      local_280 = local_740;
      uStack_738 = auVar3._8_8_;
      uStack_278 = uStack_738;
      local_290 = CONCAT44(fStack_7ac,local_7b0);
      uStack_288 = CONCAT44(fStack_7a4,fStack_7a8);
      auVar53._4_4_ = fStack_7ac;
      auVar53._0_4_ = local_7b0;
      auVar53._8_4_ = fStack_7a8;
      auVar53._12_4_ = fStack_7a4;
      local_2a0[0] = 0.041666646;
      local_2a0[1] = 0.041666646;
      afStack_298[0] = 0.041666646;
      afStack_298[1] = 0.041666646;
      auVar39._8_4_ = 0.041666646;
      auVar39._12_4_ = 0.041666646;
      auVar39._0_4_ = 0.041666646;
      auVar39._4_4_ = 0.041666646;
      auVar3 = vfmadd213ps_fma(auVar53,auVar3,auVar39);
      local_740 = auVar3._0_8_;
      uStack_738 = auVar3._8_8_;
      local_5b0 = CONCAT44(fStack_7ac,local_7b0);
      uStack_5a8 = CONCAT44(fStack_7a4,fStack_7a8);
      local_5a0 = local_740;
      uVar63 = local_5a0;
      uStack_598 = uStack_738;
      uVar64 = uStack_598;
      local_5a0._0_4_ = auVar3._0_4_;
      local_5a0._4_4_ = auVar3._4_4_;
      uStack_598._0_4_ = auVar3._8_4_;
      uStack_598._4_4_ = auVar3._12_4_;
      local_740._4_4_ = local_5a0._4_4_ * fStack_7ac;
      local_740._0_4_ = (float)local_5a0 * local_7b0;
      uStack_738._0_4_ = (float)uStack_598 * fStack_7a8;
      uStack_738._4_4_ = uStack_598._4_4_ * fStack_7a4;
      local_5d0 = CONCAT44(fStack_7ac,local_7b0);
      uStack_5c8 = CONCAT44(fStack_7a4,fStack_7a8);
      local_5c0 = local_740;
      uStack_5b8 = uStack_738;
      local_740._4_4_ = local_5a0._4_4_ * fStack_7ac * fStack_7ac;
      local_740._0_4_ = (float)local_5a0 * local_7b0 * local_7b0;
      uStack_738._0_4_ = (float)uStack_598 * fStack_7a8 * fStack_7a8;
      uStack_738._4_4_ = uStack_598._4_4_ * fStack_7a4 * fStack_7a4;
      local_4c0 = ::_ps_0p5;
      local_370 = CONCAT44(fStack_7ac,local_7b0);
      uStack_368 = CONCAT44(fStack_7a4,fStack_7a8);
      auVar54._4_4_ = fStack_7ac;
      auVar54._0_4_ = local_7b0;
      auVar54._8_4_ = fStack_7a8;
      auVar54._12_4_ = fStack_7a4;
      local_380[0] = 0.5;
      local_380[1] = 0.5;
      afStack_378[0] = 0.5;
      afStack_378[1] = 0.5;
      local_390 = local_740;
      uStack_388 = uStack_738;
      auVar37._8_4_ = 0.5;
      auVar37._12_4_ = 0.5;
      auVar37._0_4_ = 0.5;
      auVar37._4_4_ = 0.5;
      auVar3 = vfnmadd213ps_fma(auVar37,auVar54,_local_740);
      local_740 = auVar3._0_8_;
      uStack_738 = auVar3._8_8_;
      local_500 = local_740;
      uVar77 = local_500;
      uStack_4f8 = uStack_738;
      uVar78 = uStack_4f8;
      local_510 = 0x3f800000;
      uStack_50c = 0x3f800000;
      uStack_508 = 0x3f800000;
      uStack_504 = 0x3f800000;
      local_500._0_4_ = auVar3._0_4_;
      local_500._4_4_ = auVar3._4_4_;
      uStack_4f8._0_4_ = auVar3._8_4_;
      uStack_4f8._4_4_ = auVar3._12_4_;
      local_740._4_4_ = local_500._4_4_ + 1.0;
      local_740._0_4_ = (float)local_500 + 1.0;
      uStack_738._0_4_ = (float)uStack_4f8 + 1.0;
      uStack_738._4_4_ = uStack_4f8._4_4_ + 1.0;
      uStack_7b8._0_4_ = 0xb94ca1f9;
      local_7c0 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_7b8._4_4_ = 0xb94ca1f9;
      local_4a0 = local_7c0;
      local_480 = _ps_sincof_p1;
      local_250 = 0xb94ca1f9b94ca1f9;
      uStack_248 = uStack_7b8;
      local_260 = CONCAT44(fStack_7ac,local_7b0);
      uStack_258 = CONCAT44(fStack_7a4,fStack_7a8);
      auVar55._4_4_ = fStack_7ac;
      auVar55._0_4_ = local_7b0;
      auVar55._8_4_ = fStack_7a8;
      auVar55._12_4_ = fStack_7a4;
      local_270[0] = 0.008332161;
      local_270[1] = 0.008332161;
      afStack_268[0] = 0.008332161;
      afStack_268[1] = 0.008332161;
      auVar40._8_4_ = 0.008332161;
      auVar40._12_4_ = 0.008332161;
      auVar40._0_4_ = 0.008332161;
      auVar40._4_4_ = 0.008332161;
      auVar3 = vfmadd213ps_fma(auVar55,_local_7c0,auVar40);
      local_498 = _ps_sincof_p2;
      local_7c0 = auVar3._0_8_;
      local_220 = local_7c0;
      uStack_7b8 = auVar3._8_8_;
      uStack_218 = uStack_7b8;
      local_230 = CONCAT44(fStack_7ac,local_7b0);
      uStack_228 = CONCAT44(fStack_7a4,fStack_7a8);
      auVar56._4_4_ = fStack_7ac;
      auVar56._0_4_ = local_7b0;
      auVar56._8_4_ = fStack_7a8;
      auVar56._12_4_ = fStack_7a4;
      local_240[0] = -0.16666655;
      local_240[1] = -0.16666655;
      afStack_238[0] = -0.16666655;
      afStack_238[1] = -0.16666655;
      auVar41._8_4_ = -0.16666655;
      auVar41._12_4_ = -0.16666655;
      auVar41._0_4_ = -0.16666655;
      auVar41._4_4_ = -0.16666655;
      auVar3 = vfmadd213ps_fma(auVar56,auVar3,auVar41);
      local_7c0 = auVar3._0_8_;
      uStack_7b8 = auVar3._8_8_;
      local_5f0 = CONCAT44(fStack_7ac,local_7b0);
      uStack_5e8 = CONCAT44(fStack_7a4,fStack_7a8);
      local_5e0 = local_7c0;
      uVar92 = local_5e0;
      uStack_5d8 = uStack_7b8;
      uVar93 = uStack_5d8;
      local_5e0._0_4_ = auVar3._0_4_;
      local_5e0._4_4_ = auVar3._4_4_;
      uStack_5d8._0_4_ = auVar3._8_4_;
      uStack_5d8._4_4_ = auVar3._12_4_;
      local_7c0._4_4_ = local_5e0._4_4_ * fStack_7ac;
      local_7c0._0_4_ = (float)local_5e0 * local_7b0;
      uStack_7b8._0_4_ = (float)uStack_5d8 * fStack_7a8;
      uStack_7b8._4_4_ = uStack_5d8._4_4_ * fStack_7a4;
      local_1f0 = local_7c0;
      uStack_1e8 = uStack_7b8;
      local_200 = local_6e0._0_8_;
      uStack_1f8 = local_6e0._8_8_;
      local_210 = local_6e0._0_8_;
      uStack_208 = local_6e0._8_8_;
      auVar3 = vfmadd213ps_fma(local_6e0,_local_7c0,local_6e0);
      local_720._4_4_ = local_760._4_4_;
      uStack_718._4_4_ = local_760._12_4_;
      local_7c0 = auVar3._0_8_;
      uStack_7b8 = auVar3._8_8_;
      local_690 = local_760._0_8_;
      uStack_688 = local_760._8_8_;
      local_6a0 = local_7c0;
      uStack_698 = uStack_7b8;
      local_7d0 = vpand_avx(local_760,auVar3);
      local_c0 = local_760._0_8_;
      uStack_b8 = local_760._8_8_;
      local_d0 = local_740;
      uStack_c8 = uStack_738;
      auVar46._8_8_ = uStack_738;
      auVar46._0_8_ = local_740;
      local_7e0 = vpandn_avx(local_760,auVar46);
      local_610 = local_7c0;
      uStack_608 = uStack_7b8;
      local_620 = local_7d0._0_8_;
      uStack_618 = local_7d0._8_8_;
      _local_7c0 = vsubps_avx(auVar3,local_7d0);
      local_630 = local_740;
      uStack_628 = uStack_738;
      local_640 = local_7e0._0_8_;
      uStack_638 = local_7e0._8_8_;
      auVar7._8_8_ = uStack_738;
      auVar7._0_8_ = local_740;
      _local_740 = vsubps_avx(auVar7,local_7e0);
      local_520 = local_7e0._0_8_;
      uVar75 = local_520;
      uStack_518 = local_7e0._8_8_;
      uVar76 = uStack_518;
      local_530 = local_7d0._0_8_;
      uVar73 = local_530;
      uStack_528 = local_7d0._8_8_;
      uVar74 = uStack_528;
      local_520._0_4_ = local_7e0._0_4_;
      local_520._4_4_ = local_7e0._4_4_;
      uStack_518._0_4_ = local_7e0._8_4_;
      uStack_518._4_4_ = local_7e0._12_4_;
      local_530._0_4_ = local_7d0._0_4_;
      local_530._4_4_ = local_7d0._4_4_;
      uStack_528._0_4_ = local_7d0._8_4_;
      uStack_528._4_4_ = local_7d0._12_4_;
      local_700 = (float)local_520 + (float)local_530;
      fStack_6fc = local_520._4_4_ + local_530._4_4_;
      fStack_6f8 = (float)uStack_518 + (float)uStack_528;
      fStack_6f4 = uStack_518._4_4_ + uStack_528._4_4_;
      local_540 = local_740;
      uVar71 = local_540;
      uStack_538 = uStack_738;
      uVar72 = uStack_538;
      local_550 = local_7c0;
      uVar69 = local_550;
      uStack_548 = uStack_7b8;
      uVar70 = uStack_548;
      local_540._0_4_ = local_740._0_4_;
      local_540._4_4_ = local_740._4_4_;
      uStack_538._0_4_ = local_740._8_4_;
      uStack_538._4_4_ = local_740._12_4_;
      local_550._0_4_ = local_7c0._0_4_;
      local_550._4_4_ = local_7c0._4_4_;
      uStack_548._0_4_ = local_7c0._8_4_;
      uStack_548._4_4_ = local_7c0._12_4_;
      local_710 = (float)local_540 + (float)local_550;
      fStack_70c = local_540._4_4_ + local_550._4_4_;
      fStack_708 = (float)uStack_538 + (float)uStack_548;
      fStack_704 = uStack_538._4_4_ + uStack_548._4_4_;
      local_100 = CONCAT44(fStack_6fc,local_700);
      uStack_f8 = CONCAT44(fStack_6f4,fStack_6f8);
      local_870._0_8_ = local_100 ^ local_110;
      local_870._8_8_ = uStack_f8 ^ uStack_108;
      local_120 = CONCAT44(fStack_70c,local_710);
      uStack_118 = CONCAT44(fStack_704,fStack_708);
      local_130 = local_770._0_8_;
      uStack_128 = local_770._8_8_;
      auVar3._8_8_ = uStack_118;
      auVar3._0_8_ = local_120;
      auVar3 = auVar3 ^ local_770;
      fStack_874 = auVar3._12_4_;
      fStack_878 = auVar3._8_4_;
      fStack_87c = auVar3._4_4_;
      local_880 = auVar3._0_4_;
      local_810 = auVar3._0_8_;
      uStack_808 = auVar3._8_8_;
      local_830 = (undefined1  [16])0x0;
      local_90 = 0;
      uStack_88 = 0;
      uVar13 = vcmpps_avx512vl(auVar3,ZEXT816(0),0);
      local_8a0 = vpmovm2d_avx512vl(uVar13);
      local_840 = 0x322bcc77322bcc77;
      uStack_838 = 0x322bcc77322bcc77;
      local_850 = local_8a0._0_8_;
      uStack_848 = local_8a0._8_8_;
      auVar4._8_8_ = 0x322bcc77322bcc77;
      auVar4._0_8_ = 0x322bcc77322bcc77;
      local_8b0 = vpand_avx(auVar4,local_8a0);
      local_820._0_4_ = local_8b0._0_4_;
      local_820._4_4_ = local_8b0._4_4_;
      uStack_818._0_4_ = local_8b0._8_4_;
      uStack_818._4_4_ = local_8b0._12_4_;
      local_880 = local_880 + (float)local_820;
      fStack_87c = fStack_87c + local_820._4_4_;
      fStack_878 = fStack_878 + (float)uStack_818;
      fStack_874 = fStack_874 + uStack_818._4_4_;
      local_70 = CONCAT44(fStack_87c,local_880);
      uStack_68 = CONCAT44(fStack_874,fStack_878);
      auVar48._8_8_ = uStack_68;
      auVar48._0_8_ = local_70;
      local_8c0 = vdivps_avx(local_870,auVar48);
      local_3ab0 = local_8c0._0_8_;
      uStack_3aa8 = local_8c0._8_8_;
      local_38c0 = local_39f0;
      local_38d0 = local_8c0._0_8_;
      uStack_38c8 = local_8c0._8_8_;
      *(undefined1 (*) [16])*local_39f0 = local_8c0;
      local_39f0 = (undefined1 (*) [64])(*local_39f0 + 0x10);
      local_820 = local_8b0._0_8_;
      uStack_818 = local_8b0._8_8_;
      uVar13 = local_760._0_8_;
      uVar91 = local_760._8_8_;
      local_670 = local_860;
      uStack_668 = uStack_858;
      local_650 = local_860;
      uStack_648 = uStack_858;
      local_5e0 = uVar92;
      uStack_5d8 = uVar93;
      local_5a0 = uVar63;
      uStack_598 = uVar64;
      local_580 = uVar65;
      uStack_578 = uVar66;
      local_560 = uVar67;
      uStack_558 = uVar68;
      local_550 = uVar69;
      uStack_548 = uVar70;
      local_540 = uVar71;
      uStack_538 = uVar72;
      local_530 = uVar73;
      uStack_528 = uVar74;
      local_520 = uVar75;
      uStack_518 = uVar76;
      local_500 = uVar77;
      uStack_4f8 = uVar78;
      local_4a8 = local_4b0;
      local_490 = local_4b8;
      local_488 = local_4a0;
      local_478 = local_4b8;
      local_470 = local_4a0;
      local_460 = local_4b8;
      local_458 = local_4c8;
      local_448 = local_4b8;
      local_440 = local_4c8;
      local_438 = local_4b0;
      local_428 = local_4c8;
      local_420 = local_4b0;
      local_410 = local_4c8;
      local_408 = local_4b0;
      local_3f8 = local_4c8;
      local_80 = local_810;
      uStack_78 = uStack_808;
    }
    for (; uStack_718._4_4_ = uVar99, local_720._4_4_ = uVar98, uStack_1648._4_4_ = uVar97,
        uStack_1650._4_4_ = uVar96, uStack_1658._4_4_ = uVar95, local_1660._4_4_ = uVar94,
        uVar99 = uStack_718._4_4_, uVar98 = local_720._4_4_, uVar97 = uStack_1648._4_4_,
        uVar96 = uStack_1650._4_4_, uVar95 = uStack_1658._4_4_, uVar94 = local_1660._4_4_,
        local_3a3c < local_39e4; local_3a3c = local_3a3c + 1) {
      local_3808 = local_39c9;
      local_3810 = local_39f0;
      uVar13 = local_1660;
      local_1660._4_4_ = uVar94;
      uVar91 = uStack_1658;
      uStack_1658._4_4_ = uVar95;
      uVar92 = uStack_1650;
      uStack_1650._4_4_ = uVar96;
      uVar93 = uStack_1648;
      uStack_1648._4_4_ = uVar97;
      uVar63 = local_720;
      local_720._4_4_ = uVar98;
      uVar64 = uStack_718;
      uStack_718._4_4_ = uVar99;
      fVar107 = tanf(*(float *)*local_39f0);
      uVar99 = uStack_718._4_4_;
      uVar98 = local_720._4_4_;
      uVar97 = uStack_1648._4_4_;
      uVar96 = uStack_1650._4_4_;
      uVar95 = uStack_1658._4_4_;
      uVar94 = local_1660._4_4_;
      *(float *)*local_39f0 = fVar107;
      local_39f0 = (undefined1 (*) [64])(*local_39f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}